

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  uint64_t uVar348;
  secp256k1_gej *psVar349;
  ulong uVar350;
  secp256k1_gej *psVar351;
  byte bVar352;
  byte bVar353;
  uint uVar354;
  int iVar355;
  ulong uVar356;
  secp256k1_modinv64_modinfo *psVar357;
  long lVar358;
  uint uVar359;
  int iVar360;
  ulong uVar361;
  ulong uVar362;
  ulong uVar363;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *extraout_RDX_02;
  secp256k1_modinv64_modinfo *modinfo;
  secp256k1_gej *extraout_RDX_03;
  long lVar364;
  secp256k1_gej *a;
  secp256k1_gej *psVar365;
  ulong uVar366;
  secp256k1_modinv64_modinfo *unaff_RBP;
  int iVar367;
  ulong uVar368;
  secp256k1_gej *psVar369;
  secp256k1_gej *psVar370;
  secp256k1_gej *psVar371;
  secp256k1_gej *psVar372;
  uint64_t *puVar373;
  long lVar374;
  uint64_t *puVar375;
  secp256k1_gej *psVar376;
  secp256k1_gej *psVar377;
  int iVar378;
  secp256k1_gej *psVar379;
  secp256k1_gej *psVar380;
  secp256k1_gej *psVar381;
  secp256k1_fe *a_00;
  secp256k1_gej *psVar382;
  bool bVar383;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 d;
  secp256k1_fe tmp;
  secp256k1_ge sStack_948;
  secp256k1_ge sStack_8e0;
  secp256k1_gej sStack_878;
  secp256k1_gej *psStack_7e0;
  secp256k1_gej *psStack_7d8;
  secp256k1_gej *psStack_7d0;
  secp256k1_gej *psStack_7c8;
  secp256k1_gej *psStack_7c0;
  secp256k1_gej *psStack_7b0;
  secp256k1_gej *psStack_7a8;
  ulong uStack_7a0;
  secp256k1_gej *psStack_798;
  secp256k1_fe *psStack_790;
  secp256k1_gej *psStack_788;
  secp256k1_gej *psStack_780;
  secp256k1_gej *psStack_778;
  ulong uStack_770;
  secp256k1_gej *psStack_768;
  secp256k1_gej *psStack_760;
  secp256k1_gej *psStack_758;
  secp256k1_gej *psStack_750;
  secp256k1_gej *psStack_748;
  secp256k1_gej *psStack_740;
  undefined1 auStack_738 [56];
  uint64_t uStack_700;
  uint64_t uStack_6f8;
  uint64_t uStack_6f0;
  uint64_t uStack_6e8;
  uint uStack_6e0;
  undefined1 auStack_6d8 [56];
  uint64_t uStack_6a0;
  uint64_t uStack_698;
  uint64_t uStack_690;
  uint64_t uStack_688;
  int iStack_680;
  undefined1 auStack_678 [56];
  uint64_t uStack_640;
  uint64_t uStack_638;
  uint64_t uStack_630;
  uint64_t uStack_628;
  int iStack_620;
  int iStack_61c;
  ulong uStack_610;
  undefined1 auStack_608 [56];
  secp256k1_gej *psStack_5d0;
  secp256k1_gej *psStack_5c8;
  secp256k1_gej *psStack_5c0;
  ulong uStack_5b8;
  ulong uStack_5b0;
  undefined1 auStack_5a8 [64];
  ulong uStack_568;
  ulong uStack_560;
  ulong uStack_558;
  long lStack_550;
  uint64_t uStack_548;
  secp256k1_fe sStack_540;
  secp256k1_gej *psStack_510;
  secp256k1_gej *psStack_508;
  secp256k1_gej *psStack_500;
  secp256k1_fe *psStack_4f8;
  secp256k1_gej *psStack_4f0;
  secp256k1_gej *psStack_4e8;
  ulong uStack_4d8;
  secp256k1_gej *psStack_4d0;
  ulong uStack_4c8;
  undefined1 auStack_4c0 [56];
  uint64_t uStack_488;
  uint64_t uStack_480;
  uint64_t uStack_478;
  uint64_t uStack_470;
  int iStack_468;
  int iStack_464;
  secp256k1_gej *psStack_458;
  secp256k1_gej *psStack_450;
  secp256k1_gej *psStack_448;
  secp256k1_gej *psStack_440;
  secp256k1_gej *psStack_438;
  secp256k1_gej *psStack_430;
  ulong uStack_420;
  secp256k1_gej *psStack_418;
  undefined1 auStack_410 [40];
  undefined1 auStack_3e8 [56];
  uint64_t uStack_3b0;
  uint64_t uStack_3a8;
  uint64_t uStack_3a0;
  uint64_t uStack_398;
  undefined8 uStack_390;
  secp256k1_modinv64_trans2x2 sStack_388;
  undefined1 auStack_368 [96];
  secp256k1_gej *psStack_308;
  secp256k1_gej *psStack_2f8;
  ulong uStack_2f0;
  ulong uStack_2e8;
  ulong uStack_2e0;
  secp256k1_fe sStack_2d8;
  secp256k1_gej *psStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_gej *psStack_298;
  secp256k1_gej *psStack_290;
  secp256k1_gej *psStack_288;
  secp256k1_gej *psStack_280;
  uchar auStack_274 [4];
  undefined1 auStack_270 [144];
  long lStack_1e0;
  long lStack_1d8;
  long lStack_1d0;
  secp256k1_gej *psStack_1c8;
  secp256k1_gej *psStack_1c0;
  secp256k1_gej *psStack_1b8;
  secp256k1_gej *psStack_1b0;
  secp256k1_gej *psStack_1a8;
  secp256k1_gej *psStack_1a0;
  undefined8 uStack_198;
  secp256k1_gej *local_190;
  undefined1 local_188 [48];
  uint64_t local_158;
  ulong local_150;
  ulong local_148;
  secp256k1_gej *local_140;
  undefined1 local_138 [56];
  ulong auStack_100 [5];
  secp256k1_modinv64_trans2x2 local_d8;
  secp256k1_modinv64_signed62 local_b8;
  secp256k1_modinv64_signed62 local_90;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  
  bVar353 = 0;
  psVar382 = (secp256k1_gej *)0xf000000000000;
  psStack_1a0 = (secp256k1_gej *)0x122139;
  local_140 = (secp256k1_gej *)r;
  secp256k1_fe_verify(x);
  local_158 = 0x1000003d1;
  uVar356 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar368 = (uVar356 >> 0x34) + x->n[1];
  uVar361 = (uVar368 >> 0x34) + x->n[2];
  uVar362 = (uVar361 >> 0x34) + x->n[3];
  uVar363 = (uVar362 >> 0x34) + (x->n[4] & 0xffffffffffff);
  local_148 = (uVar368 | uVar356 | uVar361 | uVar362) & 0xfffffffffffff | uVar363;
  local_150 = (uVar356 ^ 0x1000003d0) & uVar368 & uVar361 & uVar362 & (uVar363 ^ 0xf000000000000);
  psStack_1a0 = (secp256k1_gej *)0x1221b3;
  secp256k1_fe_verify(x);
  local_68 = x->n[0];
  uStack_60 = x->n[1];
  local_58 = x->n[2];
  uStack_50 = x->n[3];
  local_48 = x->n[4];
  uStack_40._0_4_ = x->magnitude;
  uStack_40._4_4_ = x->normalized;
  psVar365 = (secp256k1_gej *)&stack0xffffffffffffff98;
  psStack_1a0 = (secp256k1_gej *)0x1221e2;
  local_188._40_8_ = x;
  secp256k1_fe_normalize_var((secp256k1_fe *)psVar365);
  local_138._0_8_ = (uStack_60 << 0x34 | local_68) & 0x3fffffffffffffff;
  local_138._8_8_ = (ulong)((uint)local_58 & 0xfffff) << 0x2a | uStack_60 >> 10;
  local_138._16_8_ = (ulong)((uint)uStack_50 & 0x3fffffff) << 0x20 | local_58 >> 0x14;
  local_138._24_8_ = (local_48 & 0xffffffffff) << 0x16 | uStack_50 >> 0x1e;
  local_138._32_8_ = local_48 >> 0x28;
  local_b8.v[2] = 0;
  local_b8.v[3] = 0;
  local_b8.v[0] = 0;
  local_b8.v[1] = 0;
  local_b8.v[4] = 0;
  local_90.v[3] = 0;
  local_90.v[4] = 0;
  local_90.v[1] = 0;
  local_90.v[2] = 0;
  local_90.v[0] = 1;
  local_188._16_8_ = 0;
  local_188._24_8_ = 0;
  local_188._0_8_ = -0x1000003d1;
  local_188._8_8_ = 0;
  local_188._32_8_ = 0x100;
  local_190 = (secp256k1_gej *)0x0;
  psVar381 = (secp256k1_gej *)0xffffffffffffffff;
  uStack_198._4_4_ = 5;
  local_138._48_8_ = local_138._0_8_;
  auStack_100[0] = local_138._8_8_;
  auStack_100[1] = local_138._16_8_;
  auStack_100[2] = local_138._24_8_;
  auStack_100[3] = local_138._32_8_;
LAB_001222fb:
  psVar351 = (secp256k1_gej *)local_188._0_8_;
  psVar349 = (secp256k1_gej *)0x0;
  psVar377 = (secp256k1_gej *)0x0;
  psVar372 = (secp256k1_gej *)0x1;
  uVar359 = 0x3e;
  psVar369 = (secp256k1_gej *)0x1;
  uVar356 = local_138._48_8_;
  psVar380 = (secp256k1_gej *)local_188._0_8_;
  while( true ) {
    psVar370 = (secp256k1_gej *)(-1L << ((byte)uVar359 & 0x3f) | uVar356);
    psVar357 = (secp256k1_modinv64_modinfo *)0x0;
    if (psVar370 != (secp256k1_gej *)0x0) {
      for (; ((ulong)psVar370 >> (long)psVar357 & 1) == 0;
          psVar357 = (secp256k1_modinv64_modinfo *)((long)(psVar357->modulus).v + 1)) {
      }
    }
    bVar352 = (byte)psVar357;
    psVar379 = (secp256k1_gej *)(uVar356 >> (bVar352 & 0x3f));
    psVar369 = (secp256k1_gej *)((long)psVar369 << (bVar352 & 0x3f));
    psVar349 = (secp256k1_gej *)((long)psVar349 << (bVar352 & 0x3f));
    psVar381 = (secp256k1_gej *)((long)psVar381 - (long)psVar357);
    uVar359 = uVar359 - (int)psVar357;
    if (uVar359 == 0) break;
    if (((ulong)psVar380 & 1) == 0) {
      psStack_1a0 = (secp256k1_gej *)0x122894;
      secp256k1_fe_inv_var_cold_8();
LAB_00122894:
      psStack_1a0 = (secp256k1_gej *)0x122899;
      secp256k1_fe_inv_var_cold_7();
LAB_00122899:
      psStack_1a0 = (secp256k1_gej *)0x12289e;
      secp256k1_fe_inv_var_cold_1();
LAB_0012289e:
      psStack_1a0 = (secp256k1_gej *)0x1228a3;
      secp256k1_fe_inv_var_cold_2();
LAB_001228a3:
      psStack_1a0 = (secp256k1_gej *)0x1228a8;
      secp256k1_fe_inv_var_cold_6();
      psVar379 = psVar380;
      goto LAB_001228a8;
    }
    if (((ulong)psVar379 & 1) == 0) goto LAB_00122894;
    psVar370 = (secp256k1_gej *)
               ((long)psVar349 * local_138._48_8_ + (long)psVar369 * local_188._0_8_);
    psVar357 = (secp256k1_modinv64_modinfo *)(ulong)(0x3e - uVar359);
    bVar352 = (byte)(0x3e - uVar359);
    psVar365 = (secp256k1_gej *)((long)psVar380 << (bVar352 & 0x3f));
    if (psVar370 != psVar365) goto LAB_00122899;
    psVar365 = (secp256k1_gej *)
               ((long)psVar372 * local_138._48_8_ + (long)psVar377 * local_188._0_8_);
    psVar370 = (secp256k1_gej *)((long)psVar379 << (bVar352 & 0x3f));
    if (psVar365 != psVar370) goto LAB_0012289e;
    psVar357 = (secp256k1_modinv64_modinfo *)((long)psVar381[-5].x.n + 0xe);
    if (psVar357 < (secp256k1_modinv64_modinfo *)0xfffffffffffffa2d) goto LAB_001228a3;
    iVar360 = (int)psVar379;
    if ((long)psVar381 < 0) {
      psVar381 = (secp256k1_gej *)-(long)psVar381;
      uVar354 = (int)psVar381 + 1;
      if ((int)uVar359 <= (int)uVar354) {
        uVar354 = uVar359;
      }
      psVar357 = (secp256k1_modinv64_modinfo *)(ulong)uVar354;
      psVar370 = (secp256k1_gej *)(ulong)(uVar354 - 0x3f);
      if (0xffffffc1 < uVar354 - 0x3f) {
        psVar376 = (secp256k1_gej *)-(long)psVar349;
        unaff_RBP = (secp256k1_modinv64_modinfo *)-(long)psVar369;
        psVar371 = (secp256k1_gej *)-(long)psVar380;
        psVar365 = (secp256k1_gej *)
                   ((ulong)(0x3fL << (-(char)uVar354 & 0x3fU)) >> (-(char)uVar354 & 0x3fU));
        uVar354 = (iVar360 * iVar360 + 0x3e) * iVar360 * (int)psVar371 & (uint)psVar365;
        psVar349 = psVar372;
        psVar369 = psVar377;
        psVar382 = psVar376;
        goto LAB_00122455;
      }
      goto LAB_001228b2;
    }
    uVar354 = (int)psVar381 + 1;
    if ((int)uVar359 <= (int)uVar354) {
      uVar354 = uVar359;
    }
    psVar357 = (secp256k1_modinv64_modinfo *)(ulong)uVar354;
    psVar370 = (secp256k1_gej *)(ulong)(uVar354 - 0x3f);
    if (uVar354 - 0x3f < 0xffffffc2) goto LAB_001228ad;
    psVar365 = (secp256k1_gej *)
               ((ulong)(0xfL << (-(char)uVar354 & 0x3fU)) >> (-(char)uVar354 & 0x3fU));
    uVar354 = -(iVar360 * (((int)psVar380 * 2 + 2U & 8) + (int)psVar380)) & (uint)psVar365;
    unaff_RBP = (secp256k1_modinv64_modinfo *)psVar377;
    psVar376 = psVar372;
    psVar371 = psVar379;
    psVar379 = psVar380;
LAB_00122455:
    uVar361 = (ulong)uVar354;
    psVar370 = (secp256k1_gej *)(uVar361 * (long)psVar379);
    uVar356 = (long)(psVar371->x).n + (long)(psVar370->x).n;
    psVar377 = (secp256k1_gej *)
               ((long)(((secp256k1_gej *)unaff_RBP)->x).n + (long)psVar369 * uVar361);
    psVar357 = (secp256k1_modinv64_modinfo *)(uVar361 * (long)psVar349);
    psVar372 = (secp256k1_gej *)((long)(psVar376->x).n + (long)(psVar357->modulus).v);
    psVar380 = psVar379;
    if ((uVar356 & (ulong)psVar365) != 0) {
LAB_001228a8:
      psStack_1a0 = (secp256k1_gej *)0x1228ad;
      secp256k1_fe_inv_var_cold_4();
      psVar380 = psVar379;
LAB_001228ad:
      psStack_1a0 = (secp256k1_gej *)0x1228b2;
      secp256k1_fe_inv_var_cold_3();
LAB_001228b2:
      psStack_1a0 = (secp256k1_gej *)0x1228b7;
      secp256k1_fe_inv_var_cold_5();
      goto LAB_001228b7;
    }
  }
  psVar370 = (secp256k1_gej *)((long)psVar349 * (long)psVar377);
  psVar357 = SUB168(SEXT816((long)psVar349) * SEXT816((long)psVar377),8);
  psStack_1c0 = (secp256k1_gej *)local_188._0_8_;
  local_d8.u = (int64_t)psVar369;
  local_d8.v = (int64_t)psVar349;
  local_d8.q = (int64_t)psVar377;
  local_d8.r = (int64_t)psVar372;
  if ((long)psVar369 * (long)psVar372 - (long)psVar370 != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar369) * SEXT816((long)psVar372),8) - (long)psVar357 !=
      (ulong)((secp256k1_gej *)((long)psVar369 * (long)psVar372) < psVar370)) goto LAB_001228f3;
  psStack_1a0 = (secp256k1_gej *)0x1224db;
  secp256k1_modinv64_update_de_62(&local_b8,&local_90,&local_d8,psVar357);
  uVar359 = uStack_198._4_4_;
  psVar382 = (secp256k1_gej *)local_188;
  psVar365 = (secp256k1_gej *)(ulong)uStack_198._4_4_;
  psVar369 = (secp256k1_gej *)(ulong)uStack_198._4_4_;
  unaff_RBP = &secp256k1_const_modinfo_fe;
  psVar357 = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
  psStack_1a0 = (secp256k1_gej *)0x1224ff;
  psVar370 = psVar382;
  iVar360 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar382,uStack_198._4_4_,
                       &secp256k1_const_modinfo_fe.modulus,-1);
  psVar380 = local_190;
  psVar351 = (secp256k1_gej *)(local_138 + 0x30);
  if (0 < iVar360) {
    psVar357 = (secp256k1_modinv64_modinfo *)0x1;
    psVar369 = (secp256k1_gej *)(ulong)uVar359;
    psStack_1a0 = (secp256k1_gej *)0x122526;
    psVar370 = psVar382;
    iVar360 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar382,uVar359,
                         &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar360) goto LAB_001228bc;
    psVar369 = (secp256k1_gej *)(ulong)uVar359;
    psVar357 = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1a0 = (secp256k1_gej *)0x122542;
    psVar370 = psVar351;
    iVar360 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar351,uVar359,
                         &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar360 < 1) goto LAB_001228c1;
    psVar357 = (secp256k1_modinv64_modinfo *)0x1;
    psVar369 = (secp256k1_gej *)(ulong)uVar359;
    psStack_1a0 = (secp256k1_gej *)0x12255c;
    psVar370 = psVar351;
    iVar360 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar351,uVar359,
                         &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar360) goto LAB_001228c6;
    psStack_1a0 = (secp256k1_gej *)0x122579;
    secp256k1_modinv64_update_fg_62_var
              (uVar359,(secp256k1_modinv64_signed62 *)psVar382,
               (secp256k1_modinv64_signed62 *)psVar351,&local_d8);
    if (local_138._48_8_ == 0) {
      if (1 < (int)uVar359) {
        uVar356 = 1;
        uVar361 = 0;
        do {
          uVar361 = uVar361 | auStack_100[uVar356 - 1];
          uVar356 = uVar356 + 1;
        } while (uVar359 != uVar356);
        if (uVar361 != 0) goto LAB_001225af;
      }
      psVar370 = (secp256k1_gej *)(local_138 + 0x30);
      psVar369 = (secp256k1_gej *)(ulong)uVar359;
      psVar357 = (secp256k1_modinv64_modinfo *)0x0;
      psStack_1a0 = (secp256k1_gej *)0x1226a4;
      iVar360 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar370,uVar359,&SECP256K1_SIGNED62_ONE,0
                          );
      if (iVar360 != 0) goto LAB_001228e4;
      psStack_1a0 = (secp256k1_gej *)0x1226c6;
      iVar360 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)local_188,uVar359,&SECP256K1_SIGNED62_ONE,
                           -1);
      modinfo = extraout_RDX;
      if (iVar360 != 0) {
        psStack_1a0 = (secp256k1_gej *)0x1226e6;
        iVar360 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)local_188,uVar359,
                             &SECP256K1_SIGNED62_ONE,1);
        modinfo = extraout_RDX_00;
        if (iVar360 != 0) {
          psVar370 = (secp256k1_gej *)local_138;
          psVar369 = (secp256k1_gej *)0x5;
          psVar357 = (secp256k1_modinv64_modinfo *)0x0;
          psStack_1a0 = (secp256k1_gej *)0x122706;
          iVar360 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar370,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar360 != 0) goto LAB_001228ee;
          psVar370 = (secp256k1_gej *)&local_b8;
          psVar369 = (secp256k1_gej *)0x5;
          psVar357 = (secp256k1_modinv64_modinfo *)0x0;
          psStack_1a0 = (secp256k1_gej *)0x122729;
          iVar360 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar370,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar360 != 0) goto LAB_001228ee;
          psStack_1a0 = (secp256k1_gej *)0x122749;
          iVar360 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)local_188,uVar359,
                               &secp256k1_const_modinfo_fe.modulus,1);
          modinfo = extraout_RDX_01;
          if (iVar360 != 0) {
            psVar370 = (secp256k1_gej *)local_188;
            psVar369 = (secp256k1_gej *)(ulong)uVar359;
            psVar357 = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
            psStack_1a0 = (secp256k1_gej *)0x122767;
            iVar360 = secp256k1_modinv64_mul_cmp_62
                                ((secp256k1_modinv64_signed62 *)psVar370,uVar359,
                                 &secp256k1_const_modinfo_fe.modulus,-1);
            modinfo = extraout_RDX_02;
            if (iVar360 != 0) goto LAB_001228ee;
          }
        }
      }
      psStack_1a0 = (secp256k1_gej *)0x122787;
      secp256k1_modinv64_normalize_62(&local_b8,(int64_t)(&local_190)[(int)uVar359],modinfo);
      psVar365 = local_140;
      local_138._32_8_ = local_b8.v[4];
      local_138._16_8_ = local_b8.v[2];
      local_138._24_8_ = local_b8.v[3];
      local_138._0_8_ = local_b8.v[0];
      local_138._8_8_ = local_b8.v[1];
      psStack_1a0 = (secp256k1_gej *)0x1227af;
      secp256k1_fe_from_signed62(&local_140->x,(secp256k1_modinv64_signed62 *)local_138);
      (psVar365->x).magnitude = (uint)(0 < *(int *)(local_188._40_8_ + 0x28));
      (psVar365->x).normalized = 1;
      psStack_1a0 = (secp256k1_gej *)0x1227cf;
      secp256k1_fe_verify(&psVar365->x);
      uVar356 = (psVar365->x).n[4];
      uVar362 = (uVar356 >> 0x30) * local_158 + (psVar365->x).n[0];
      uVar361 = (uVar362 >> 0x34) + (psVar365->x).n[1];
      uVar363 = (uVar361 >> 0x34) + (psVar365->x).n[2];
      uVar368 = (uVar363 >> 0x34) + (psVar365->x).n[3];
      psVar369 = (secp256k1_gej *)((uVar368 >> 0x34) + (uVar356 & 0xffffffffffff));
      psVar370 = (secp256k1_gej *)
                 ((uVar362 ^ 0x1000003d0) & uVar361 & uVar363 & uVar368 &
                 ((ulong)psVar369 ^ 0xf000000000000));
      bVar383 = psVar370 == (secp256k1_gej *)0xfffffffffffff ||
                ((uVar361 | uVar362 | uVar363 | uVar368) & 0xfffffffffffff) == 0 &&
                psVar369 == (secp256k1_gej *)0x0;
      psVar357 = (secp256k1_modinv64_modinfo *)
                 CONCAT71((int7)(((ulong)psVar369 ^ 0xf000000000000) >> 8),bVar383);
      if ((local_150 != 0xfffffffffffff && local_148 != 0) != bVar383) {
        secp256k1_fe_verify(&psVar365->x);
        return;
      }
      goto LAB_001228e9;
    }
LAB_001225af:
    lVar358 = (long)(int)uVar359;
    psVar349 = (&local_190)[lVar358];
    psVar357 = (secp256k1_modinv64_modinfo *)auStack_100[lVar358 + -2];
    psVar370 = (secp256k1_gej *)((long)psVar349 >> 0x3f ^ (ulong)psVar349 | lVar358 + -2 >> 0x3f);
    psVar369 = (secp256k1_gej *)((long)psVar357 >> 0x3f ^ (ulong)psVar357 | (ulong)psVar370);
    if (psVar369 == (secp256k1_gej *)0x0) {
      psVar365 = (secp256k1_gej *)(ulong)(uVar359 - 1);
      (&uStack_198)[lVar358] = (&uStack_198)[lVar358] | (long)psVar349 << 0x3e;
      psVar357 = (secp256k1_modinv64_modinfo *)((long)psVar357 << 0x3e);
      auStack_100[lVar358 + -3] = auStack_100[lVar358 + -3] | (ulong)psVar357;
    }
    if ((int)psVar380 == 0xb) goto LAB_001228cb;
    uVar359 = (uint)psVar365;
    unaff_RBP = &secp256k1_const_modinfo_fe;
    psVar357 = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1a0 = (secp256k1_gej *)0x12261e;
    psVar369 = psVar365;
    psVar370 = psVar382;
    iVar360 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar382,uVar359,
                         &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar360 < 1) goto LAB_001228d0;
    psVar357 = (secp256k1_modinv64_modinfo *)0x1;
    psStack_1a0 = (secp256k1_gej *)0x122638;
    psVar369 = psVar365;
    psVar370 = psVar382;
    iVar360 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar382,uVar359,
                         &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar360) goto LAB_001228d5;
    psVar357 = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1a0 = (secp256k1_gej *)0x122654;
    psVar369 = psVar365;
    psVar370 = psVar351;
    iVar360 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar351,uVar359,
                         &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar360 < 1) goto LAB_001228da;
    psVar357 = (secp256k1_modinv64_modinfo *)0x1;
    psStack_1a0 = (secp256k1_gej *)0x12266e;
    psVar369 = psVar365;
    psVar370 = psVar351;
    iVar360 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar351,uVar359,
                         &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar360) goto LAB_001228df;
    local_190 = (secp256k1_gej *)(ulong)((int)psVar380 + 1);
    uStack_198._4_4_ = uVar359;
    goto LAB_001222fb;
  }
LAB_001228b7:
  psStack_1a0 = (secp256k1_gej *)0x1228bc;
  secp256k1_fe_inv_var_cold_21();
LAB_001228bc:
  psStack_1a0 = (secp256k1_gej *)0x1228c1;
  secp256k1_fe_inv_var_cold_20();
LAB_001228c1:
  psStack_1a0 = (secp256k1_gej *)0x1228c6;
  secp256k1_fe_inv_var_cold_19();
LAB_001228c6:
  psStack_1a0 = (secp256k1_gej *)0x1228cb;
  secp256k1_fe_inv_var_cold_18();
LAB_001228cb:
  psStack_1a0 = (secp256k1_gej *)0x1228d0;
  secp256k1_fe_inv_var_cold_14();
LAB_001228d0:
  psStack_1a0 = (secp256k1_gej *)0x1228d5;
  secp256k1_fe_inv_var_cold_13();
LAB_001228d5:
  psStack_1a0 = (secp256k1_gej *)0x1228da;
  secp256k1_fe_inv_var_cold_12();
LAB_001228da:
  psStack_1a0 = (secp256k1_gej *)0x1228df;
  secp256k1_fe_inv_var_cold_11();
LAB_001228df:
  psStack_1a0 = (secp256k1_gej *)0x1228e4;
  secp256k1_fe_inv_var_cold_10();
LAB_001228e4:
  psStack_1a0 = (secp256k1_gej *)0x1228e9;
  secp256k1_fe_inv_var_cold_15();
LAB_001228e9:
  psStack_1a0 = (secp256k1_gej *)0x1228ee;
  secp256k1_fe_inv_var_cold_17();
LAB_001228ee:
  psStack_1a0 = (secp256k1_gej *)0x1228f3;
  secp256k1_fe_inv_var_cold_16();
  psStack_1c0 = psVar351;
LAB_001228f3:
  psStack_1a0 = (secp256k1_gej *)secp256k1_modinv64_update_fg_62_var;
  secp256k1_fe_inv_var_cold_9();
  iVar360 = (int)psVar370;
  psVar349 = (secp256k1_gej *)unaff_RBP;
  psVar351 = psStack_1c0;
  psStack_1c8 = psVar365;
  psStack_1b8 = psVar380;
  psStack_1b0 = psVar381;
  psStack_1a8 = psVar382;
  psStack_1a0 = (secp256k1_gej *)unaff_RBP;
  if (iVar360 < 1) {
LAB_00122ba0:
    auStack_270._120_8_ = 0x122ba5;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00122ba5:
    auStack_270._120_8_ = 0x122baa;
    secp256k1_modinv64_update_fg_62_var_cold_1();
    psVar377 = psVar381;
LAB_00122baa:
    auStack_270._120_8_ = 0x122baf;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00122baf:
    auStack_270._120_8_ = 0x122bb4;
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_00122bb4:
    auStack_270._120_8_ = 0x122bb9;
    secp256k1_modinv64_update_fg_62_var_cold_5();
    psVar381 = psVar377;
    psVar372 = psVar382;
LAB_00122bb9:
    auStack_270._120_8_ = 0x122bbe;
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lStack_1d0 = (psVar357->modulus).v[0];
    lStack_1d8 = (psVar357->modulus).v[1];
    uVar1 = (psVar369->x).n[0];
    uVar2 = (extraout_RDX_03->x).n[0];
    psVar381 = (secp256k1_gej *)(uVar1 * lStack_1d0);
    lVar364 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_1d0),8);
    uVar361 = uVar2 * lStack_1d8;
    psVar365 = SUB168(SEXT816((long)uVar2) * SEXT816(lStack_1d8),8);
    psVar380 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar356 = (ulong)((secp256k1_gej *)~uVar361 < psVar381);
    lVar358 = (0x7fffffffffffffff - (long)psVar365) - lVar364;
    psVar351 = extraout_RDX_03;
    psVar372 = (secp256k1_gej *)~uVar361;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar365,lVar364) != SBORROW8(lVar358,uVar356)) !=
        (long)(lVar358 - uVar356) < 0 && -1 < (long)psVar365) goto LAB_00122bb9;
    lStack_1e0 = (psVar357->modulus).v[2];
    psVar372 = (secp256k1_gej *)(psVar357->modulus).v[3];
    puVar375 = (uint64_t *)((long)(psVar381->x).n + uVar361);
    psVar365 = (secp256k1_gej *)
               ((long)(psVar365->x).n + (ulong)CARRY8(uVar361,(ulong)psVar381) + lVar364);
    uVar361 = uVar1 * lStack_1e0;
    psVar381 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_1e0),8);
    uVar362 = uVar2 * (long)psVar372;
    lVar364 = SUB168(SEXT816((long)uVar2) * SEXT816((long)psVar372),8);
    uVar356 = (ulong)(-uVar362 - 1 < uVar361);
    lVar358 = (0x7fffffffffffffff - lVar364) - (long)psVar381;
    auStack_270._136_8_ = psVar372;
    if ((SBORROW8(0x7fffffffffffffff - lVar364,(long)psVar381) != SBORROW8(lVar358,uVar356)) ==
        (long)(lVar358 - uVar356) < 0 || lVar364 < 0) {
      lVar358 = (long)(psVar381->x).n + (ulong)CARRY8(uVar362,uVar361) + lVar364;
      psVar382 = psVar372;
      if (((ulong)puVar375 & 0x3fffffffffffffff) != 0) goto LAB_00122ba5;
      psVar377 = psVar381;
      if ((uVar362 + uVar361 & 0x3fffffffffffffff) != 0) goto LAB_00122baa;
      uVar356 = uVar362 + uVar361 >> 0x3e | lVar358 * 4;
      uVar361 = (ulong)puVar375 >> 0x3e | (long)psVar365 * 4;
      psVar377 = (secp256k1_gej *)(lVar358 >> 0x3e);
      psVar365 = (secp256k1_gej *)((long)psVar365 >> 0x3e);
      auStack_270._132_4_ = iVar360;
      if (iVar360 != 1) {
        psVar349 = (secp256k1_gej *)0x3fffffffffffffff;
        psVar370 = (secp256k1_gej *)((ulong)psVar370 & 0xffffffff);
        psVar379 = (secp256k1_gej *)0x1;
        do {
          psVar381 = (secp256k1_gej *)(psVar369->x).n[(long)psVar379];
          psVar382 = (secp256k1_gej *)((long)psVar381 * lStack_1d0 + uVar361);
          lVar364 = (long)(psVar365->x).n +
                    (ulong)CARRY8((long)psVar381 * lStack_1d0,uVar361) +
                    SUB168(SEXT816((long)psVar381) * SEXT816(lStack_1d0),8);
          uVar1 = (extraout_RDX_03->x).n[(long)psVar379];
          uVar361 = uVar1 * lStack_1d8;
          lVar358 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_1d8),8);
          if (lVar358 < 0) {
            psVar380 = (secp256k1_gej *)((-0x8000000000000000 - lVar358) - (ulong)(uVar361 != 0));
            psVar365 = (secp256k1_gej *)
                       ((lVar364 - (long)psVar380) - (ulong)(psVar382 < (secp256k1_gej *)-uVar361));
            if ((SBORROW8(lVar364,(long)psVar380) !=
                SBORROW8(lVar364 - (long)psVar380,(ulong)(psVar382 < (secp256k1_gej *)-uVar361))) ==
                (long)psVar365 < 0) goto LAB_00122a8f;
LAB_00122b96:
            auStack_270._120_8_ = 0x122b9b;
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00122b9b:
            auStack_270._120_8_ = 0x122ba0;
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_00122ba0;
          }
          psVar365 = (secp256k1_gej *)(-1 - uVar361);
          lVar3 = (0x7fffffffffffffff - lVar358) - lVar364;
          psVar380 = (secp256k1_gej *)(lVar3 - (ulong)(psVar365 < psVar382));
          if ((SBORROW8(0x7fffffffffffffff - lVar358,lVar364) !=
              SBORROW8(lVar3,(ulong)(psVar365 < psVar382))) != (long)psVar380 < 0)
          goto LAB_00122b96;
LAB_00122a8f:
          bVar383 = CARRY8((ulong)psVar382,uVar361);
          psVar382 = (secp256k1_gej *)((long)(psVar382->x).n + uVar361);
          lVar364 = lVar364 + lVar358 + (ulong)bVar383;
          psVar365 = (secp256k1_gej *)((long)psVar381 * lStack_1e0 + uVar356);
          psVar381 = (secp256k1_gej *)
                     ((long)(psVar377->x).n +
                     (ulong)CARRY8((long)psVar381 * lStack_1e0,uVar356) +
                     SUB168(SEXT816((long)psVar381) * SEXT816(lStack_1e0),8));
          uVar356 = uVar1 * (long)psVar372;
          lVar358 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar372),8);
          if (lVar358 < 0) {
            lVar374 = (-0x8000000000000000 - lVar358) - (ulong)(uVar356 != 0);
            lVar3 = (long)psVar381 - lVar374;
            psVar380 = (secp256k1_gej *)0x7fffffffffffffff;
            if ((SBORROW8((long)psVar381,lVar374) !=
                SBORROW8(lVar3,(ulong)(psVar365 < (secp256k1_gej *)-uVar356))) !=
                (long)(lVar3 - (ulong)(psVar365 < (secp256k1_gej *)-uVar356)) < 0)
            goto LAB_00122b9b;
          }
          else {
            psVar380 = (secp256k1_gej *)0x7fffffffffffffff;
            uVar361 = (ulong)((secp256k1_gej *)(-1 - uVar356) < psVar365);
            lVar3 = (0x7fffffffffffffff - lVar358) - (long)psVar381;
            if ((SBORROW8(0x7fffffffffffffff - lVar358,(long)psVar381) != SBORROW8(lVar3,uVar361))
                != (long)(lVar3 - uVar361) < 0) goto LAB_00122b9b;
          }
          puVar375 = (uint64_t *)((long)(psVar365->x).n + uVar356);
          lVar358 = (long)(psVar381->x).n + (ulong)CARRY8((ulong)psVar365,uVar356) + lVar358;
          uVar361 = lVar364 * 4 | (ulong)psVar382 >> 0x3e;
          (psVar369->x).n[(long)&psVar379[-1].field_0x97] =
               (uint64_t)((ulong)psVar382 & 0x3fffffffffffffff);
          uVar356 = lVar358 * 4 | (ulong)puVar375 >> 0x3e;
          (extraout_RDX_03->x).n[(long)&psVar379[-1].field_0x97] =
               (ulong)puVar375 & 0x3fffffffffffffff;
          psVar379 = (secp256k1_gej *)((long)(psVar379->x).n + 1);
          psVar377 = (secp256k1_gej *)(lVar358 >> 0x3e);
          psVar365 = (secp256k1_gej *)(lVar364 >> 0x3e);
          psVar382 = (secp256k1_gej *)((ulong)psVar382 & 0x3fffffffffffffff);
        } while (psVar370 != psVar379);
      }
      psVar380 = (secp256k1_gej *)0x7fffffffffffffff;
      if ((long)(psVar365->x).n + ((ulong)(0x7fffffffffffffff < uVar361) - 1) != -1)
      goto LAB_00122baf;
      (psVar369->x).n[(long)iVar360 + -1] = uVar361;
      psVar377 = (secp256k1_gej *)
                 ((long)(psVar377->x).n + ((ulong)(0x7fffffffffffffff < uVar356) - 1));
      if (psVar377 == (secp256k1_gej *)0xffffffffffffffff) {
        (extraout_RDX_03->x).n[(long)iVar360 + -1] = uVar356;
        return;
      }
      goto LAB_00122bb4;
    }
  }
  auStack_270._120_8_ = secp256k1_ellswift_prng;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psVar382 = (secp256k1_gej *)auStack_270;
  psVar377 = psVar382;
  auStack_270._104_8_ = psVar365;
  auStack_270._112_8_ = psVar381;
  auStack_270._120_8_ = psVar372;
  for (lVar358 = 0xd; lVar358 != 0; lVar358 = lVar358 + -1) {
    (psVar377->x).n[0] = (psVar369->x).n[0];
    psVar369 = (secp256k1_gej *)((long)psVar369 + (ulong)bVar353 * -0x10 + 8);
    psVar377 = (secp256k1_gej *)((long)psVar377 + (ulong)bVar353 * -0x10 + 8);
  }
  uVar356 = (ulong)auStack_270._96_8_ >> 6;
  psStack_280 = (secp256k1_gej *)0x122bfb;
  secp256k1_sha256_write((secp256k1_sha256 *)psVar382,auStack_274,4);
  psStack_280 = (secp256k1_gej *)0x122c06;
  psVar365 = psVar370;
  psVar381 = psVar382;
  secp256k1_sha256_finalize((secp256k1_sha256 *)psVar382,(uchar *)psVar370);
  psVar357 = (secp256k1_modinv64_modinfo *)(uVar356 + 1);
  if ((secp256k1_gej *)((ulong)auStack_270._96_8_ >> 6) == (secp256k1_gej *)psVar357) {
    return;
  }
  psStack_280 = (secp256k1_gej *)secp256k1_ge_x_on_curve_var;
  secp256k1_ellswift_prng_cold_1();
  psStack_308 = (secp256k1_gej *)0x122c3b;
  psVar369 = psVar381;
  psStack_2a8 = psVar370;
  psStack_2a0 = psVar351;
  psStack_298 = psVar380;
  psStack_290 = psVar382;
  psStack_288 = (secp256k1_gej *)psVar357;
  psStack_280 = psVar349;
  secp256k1_fe_verify(&psVar381->x);
  if ((psVar381->x).magnitude < 9) {
    uVar356 = (psVar381->x).n[0];
    uVar361 = (psVar381->x).n[1];
    uVar362 = (psVar381->x).n[2];
    uVar363 = (psVar381->x).n[3];
    uVar368 = (psVar381->x).n[4];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar356 * 2;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar363;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar361 * 2;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar362;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar368;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar368;
    uVar350 = SUB168(auVar6 * auVar166,0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar350 & 0xfffffffffffff;
    auVar4 = auVar5 * auVar165 + auVar4 * auVar164 + auVar7 * ZEXT816(0x1000003d10);
    uVar366 = auVar4._0_8_;
    uStack_2e0 = uVar366 & 0xfffffffffffff;
    auVar292._8_8_ = 0;
    auVar292._0_8_ = uVar366 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar368 = uVar368 * 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar356;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar368;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar361 * 2;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar363;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar362;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar362;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar350 >> 0x34 | SUB168(auVar6 * auVar166,8) << 0xc;
    auVar4 = auVar8 * auVar167 + auVar292 + auVar9 * auVar168 + auVar10 * auVar169 +
             auVar11 * ZEXT816(0x1000003d10);
    uStack_2e8 = auVar4._0_8_;
    auVar293._8_8_ = 0;
    auVar293._0_8_ = uStack_2e8 >> 0x34 | auVar4._8_8_ << 0xc;
    uStack_2f0 = (uStack_2e8 & 0xfffffffffffff) >> 0x30;
    uStack_2e8 = uStack_2e8 & 0xffffffffffff;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar356;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar356;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar361;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar368;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar362 * 2;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar363;
    auVar4 = auVar13 * auVar171 + auVar293 + auVar14 * auVar172;
    uVar350 = auVar4._0_8_;
    auVar295._8_8_ = 0;
    auVar295._0_8_ = uVar350 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = (uVar350 & 0xfffffffffffff) << 4 | uStack_2f0;
    auVar4 = auVar12 * auVar170 + ZEXT816(0x1000003d1) * auVar173;
    uVar350 = auVar4._0_8_;
    sStack_2d8.n[0] = uVar350 & 0xfffffffffffff;
    auVar294._8_8_ = 0;
    auVar294._0_8_ = uVar350 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar356 * 2;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar361;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar362;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar368;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar363;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar363;
    auVar5 = auVar16 * auVar175 + auVar295 + auVar17 * auVar176;
    uVar350 = auVar5._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar350 & 0xfffffffffffff;
    auVar4 = auVar15 * auVar174 + auVar294 + auVar18 * ZEXT816(0x1000003d10);
    uVar366 = auVar4._0_8_;
    auVar297._8_8_ = 0;
    auVar297._0_8_ = uVar350 >> 0x34 | auVar5._8_8_ << 0xc;
    sStack_2d8.n[1] = uVar366 & 0xfffffffffffff;
    auVar296._8_8_ = 0;
    auVar296._0_8_ = uVar366 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar356 * 2;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uVar362;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar361;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar361;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar363;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar368;
    auVar297 = auVar21 * auVar179 + auVar297;
    uVar356 = auVar297._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar19 * auVar177 + auVar296 + auVar20 * auVar178 + auVar22 * ZEXT816(0x1000003d10);
    uVar361 = auVar4._0_8_;
    sStack_2d8.n[2] = uVar361 & 0xfffffffffffff;
    auVar298._8_8_ = 0;
    auVar298._0_8_ = (uVar361 >> 0x34 | auVar4._8_8_ << 0xc) + uStack_2e0;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar356 >> 0x34 | auVar297._8_8_ << 0xc;
    auVar298 = auVar23 * ZEXT816(0x1000003d10) + auVar298;
    uVar356 = auVar298._0_8_;
    sStack_2d8.n[3] = uVar356 & 0xfffffffffffff;
    sStack_2d8.n[4] = (uVar356 >> 0x34 | auVar298._8_8_ << 0xc) + uStack_2e8;
    sStack_2d8.magnitude = 1;
    sStack_2d8.normalized = 0;
    psStack_308 = (secp256k1_gej *)0x122e87;
    psStack_2f8 = psVar381;
    secp256k1_fe_verify(&sStack_2d8);
    psStack_308 = (secp256k1_gej *)0x122e97;
    secp256k1_fe_mul(&sStack_2d8,&sStack_2d8,&psStack_2f8->x);
    psStack_308 = (secp256k1_gej *)0x122e9f;
    secp256k1_fe_verify(&sStack_2d8);
    sStack_2d8.n[0] = sStack_2d8.n[0] + 2;
    sStack_2d8.normalized = 0;
    sStack_2d8.magnitude = sStack_2d8.magnitude + 1;
    psStack_308 = (secp256k1_gej *)0x122eb6;
    secp256k1_fe_verify(&sStack_2d8);
    psStack_308 = (secp256k1_gej *)0x122ebe;
    secp256k1_fe_is_square_var(&sStack_2d8);
    return;
  }
  psStack_308 = (secp256k1_gej *)secp256k1_fe_is_square_var;
  secp256k1_ge_x_on_curve_var_cold_1();
  auStack_368._0_8_ = (psVar369->x).n[0];
  auStack_368._8_8_ = (psVar369->x).n[1];
  auStack_368._16_8_ = (psVar369->x).n[2];
  auStack_368._24_8_ = (psVar369->x).n[3];
  auStack_368._32_8_ = (psVar369->x).n[4];
  auStack_368._40_4_ = (psVar369->x).magnitude;
  auStack_368._44_4_ = (psVar369->x).normalized;
  psStack_430 = (secp256k1_gej *)0x122f0e;
  auStack_368._56_8_ = psVar381;
  auStack_368._64_8_ = psVar351;
  auStack_368._72_8_ = psVar380;
  auStack_368._80_8_ = psVar382;
  auStack_368._88_8_ = psVar357;
  psStack_308 = psVar349;
  secp256k1_fe_verify(&psVar369->x);
  auStack_3e8._48_8_ = (psVar369->x).n[0];
  uStack_3b0 = (psVar369->x).n[1];
  uStack_3a8 = (psVar369->x).n[2];
  uStack_3a0 = (psVar369->x).n[3];
  uStack_398 = (psVar369->x).n[4];
  uStack_390._0_4_ = (psVar369->x).magnitude;
  uStack_390._4_4_ = (psVar369->x).normalized;
  psVar381 = (secp256k1_gej *)(auStack_3e8 + 0x30);
  psStack_430 = (secp256k1_gej *)0x122f31;
  secp256k1_fe_normalize_var((secp256k1_fe *)psVar381);
  psStack_430 = (secp256k1_gej *)0x122f39;
  psVar369 = psVar381;
  secp256k1_fe_verify((secp256k1_fe *)psVar381);
  if (uStack_390._4_4_ == 0) {
LAB_001234da:
    psStack_430 = (secp256k1_gej *)0x1234df;
    secp256k1_fe_is_square_var_cold_19();
LAB_001234df:
    psStack_430 = (secp256k1_gej *)0x1234e4;
    secp256k1_fe_is_square_var_cold_17();
  }
  else {
    if (((uStack_3a8 == 0 && uStack_3a0 == 0) && (uStack_3b0 == 0 && auStack_3e8._48_8_ == 0)) &&
        uStack_398 == 0) {
      psVar381 = (secp256k1_gej *)0x1;
    }
    else {
      auStack_410._0_8_ = (uStack_3b0 << 0x34 | auStack_3e8._48_8_) & 0x3fffffffffffffff;
      auStack_410._8_8_ = (ulong)((uint)uStack_3a8 & 0xfffff) << 0x2a | uStack_3b0 >> 10;
      auStack_410._16_8_ = (ulong)((uint)uStack_3a0 & 0x3fffffff) << 0x20 | uStack_3a8 >> 0x14;
      psVar369 = (secp256k1_gej *)((uStack_398 & 0xffffffffff) << 0x16 | uStack_3a0 >> 0x1e);
      auStack_410._32_8_ = uStack_398 >> 0x28;
      auStack_3e8._16_8_ = 0;
      auStack_3e8._24_8_ = 0;
      auStack_3e8._0_8_ = -0x1000003d1;
      auStack_3e8._8_8_ = 0;
      auStack_3e8._32_8_ = 0x100;
      psVar365 = (secp256k1_gej *)(auStack_410._8_8_ | auStack_410._0_8_);
      auStack_410._24_8_ = psVar369;
      if (((auStack_410._32_8_ == 0 && auStack_410._16_8_ == 0) && psVar365 == (secp256k1_gej *)0x0)
          && psVar369 == (secp256k1_gej *)0x0) goto LAB_001234df;
      psVar382 = (secp256k1_gej *)0x5;
      psVar349 = (secp256k1_gej *)0xffffffffffffffff;
      uVar356 = 0;
      psVar380 = (secp256k1_gej *)0xfffffffefffffc2f;
      psVar381 = (secp256k1_gej *)0x0;
      do {
        psVar369 = (secp256k1_gej *)(auStack_3e8._8_8_ << 0x3e | (ulong)psVar380);
        puVar373 = (uint64_t *)(auStack_410._8_8_ << 0x3e | auStack_410._0_8_);
        psVar372 = (secp256k1_gej *)0x0;
        psVar379 = (secp256k1_gej *)0x0;
        psVar380 = (secp256k1_gej *)0x1;
        iVar360 = 0x3e;
        psVar370 = (secp256k1_gej *)0x1;
        puVar375 = puVar373;
        psVar377 = psVar369;
        psVar351 = psVar381;
        while( true ) {
          uVar361 = -1L << ((byte)iVar360 & 0x3f) | (ulong)puVar375;
          lVar358 = 0;
          if (uVar361 != 0) {
            for (; (uVar361 >> lVar358 & 1) == 0; lVar358 = lVar358 + 1) {
            }
          }
          bVar353 = (byte)lVar358;
          psVar376 = (secp256k1_gej *)((ulong)puVar375 >> (bVar353 & 0x3f));
          psVar370 = (secp256k1_gej *)((long)psVar370 << (bVar353 & 0x3f));
          psVar372 = (secp256k1_gej *)((long)psVar372 << (bVar353 & 0x3f));
          psVar349 = (secp256k1_gej *)((long)psVar349 - lVar358);
          psVar365 = (secp256k1_gej *)((ulong)psVar377 >> 2);
          uVar359 = ((uint)((ulong)psVar377 >> 1) ^ (uint)psVar365) & (uint)lVar358 ^ (uint)psVar351
          ;
          psVar381 = (secp256k1_gej *)(ulong)uVar359;
          iVar360 = iVar360 - (uint)lVar358;
          uStack_420 = uVar356;
          psStack_418 = psVar382;
          if (iVar360 == 0) break;
          if (((ulong)psVar377 & 1) == 0) {
            psStack_430 = (secp256k1_gej *)0x12348f;
            secp256k1_fe_is_square_var_cold_7();
LAB_0012348f:
            psStack_430 = (secp256k1_gej *)0x123494;
            secp256k1_fe_is_square_var_cold_6();
LAB_00123494:
            psStack_430 = (secp256k1_gej *)0x123499;
            secp256k1_fe_is_square_var_cold_1();
LAB_00123499:
            psStack_430 = (secp256k1_gej *)0x12349e;
            secp256k1_fe_is_square_var_cold_2();
            goto LAB_0012349e;
          }
          if (((ulong)psVar376 & 1) == 0) goto LAB_0012348f;
          psVar365 = (secp256k1_gej *)
                     ((long)psVar372 * (long)puVar373 + (long)psVar370 * (long)psVar369);
          bVar353 = 0x3e - (char)iVar360;
          psVar357 = (secp256k1_modinv64_modinfo *)((long)psVar377 << (bVar353 & 0x3f));
          if (psVar365 != (secp256k1_gej *)psVar357) goto LAB_00123494;
          psVar357 = (secp256k1_modinv64_modinfo *)
                     ((long)psVar380 * (long)puVar373 + (long)psVar379 * (long)psVar369);
          psVar365 = (secp256k1_gej *)((long)psVar376 << (bVar353 & 0x3f));
          if ((secp256k1_gej *)psVar357 != psVar365) goto LAB_00123499;
          iVar378 = (int)psVar377;
          iVar367 = (int)psVar376;
          if ((long)psVar349 < 0) {
            psVar349 = (secp256k1_gej *)-(long)psVar349;
            iVar355 = (int)psVar349 + 1;
            if (iVar360 <= iVar355) {
              iVar355 = iVar360;
            }
            psVar365 = (secp256k1_gej *)(ulong)(iVar355 - 0x3fU);
            if (0xffffffc1 < iVar355 - 0x3fU) {
              psVar381 = (secp256k1_gej *)
                         (ulong)(uVar359 ^ (uint)(((ulong)psVar376 & (ulong)psVar377) >> 1));
              psVar357 = (secp256k1_modinv64_modinfo *)
                         ((ulong)(0x3fL << (-(char)iVar355 & 0x3fU)) >> (-(char)iVar355 & 0x3fU));
              uVar359 = (iVar367 * iVar367 + 0x3e) * iVar367 * iVar378 & (uint)psVar357;
              psVar351 = psVar372;
              psVar372 = psVar380;
              psVar365 = psVar370;
              psVar380 = psVar377;
              psVar377 = psVar376;
              psVar370 = psVar379;
              goto LAB_001231c3;
            }
            goto LAB_001234a8;
          }
          iVar355 = (int)psVar349 + 1;
          if (iVar360 <= iVar355) {
            iVar355 = iVar360;
          }
          psVar365 = (secp256k1_gej *)(ulong)(iVar355 - 0x3fU);
          if (iVar355 - 0x3fU < 0xffffffc2) goto LAB_001234a3;
          psVar357 = (secp256k1_modinv64_modinfo *)
                     ((ulong)(0xfL << (-(char)iVar355 & 0x3fU)) >> (-(char)iVar355 & 0x3fU));
          uVar359 = -(iVar367 * ((iVar378 * 2 + 2U & 8) + iVar378)) & (uint)psVar357;
          psVar351 = psVar380;
          psVar365 = psVar379;
          psVar380 = psVar376;
LAB_001231c3:
          uVar361 = (ulong)uVar359;
          puVar375 = (uint64_t *)((long)(psVar380->x).n + uVar361 * (long)psVar377);
          psVar379 = (secp256k1_gej *)((long)(psVar365->x).n + (long)psVar370 * uVar361);
          psVar380 = (secp256k1_gej *)((long)(psVar351->x).n + uVar361 * (long)psVar372);
          psVar351 = psVar381;
          if (((ulong)puVar375 & (ulong)psVar357) != 0) {
LAB_0012349e:
            psStack_430 = (secp256k1_gej *)0x1234a3;
            secp256k1_fe_is_square_var_cold_4();
LAB_001234a3:
            psStack_430 = (secp256k1_gej *)0x1234a8;
            secp256k1_fe_is_square_var_cold_3();
LAB_001234a8:
            psStack_430 = (secp256k1_gej *)0x1234ad;
            secp256k1_fe_is_square_var_cold_5();
            goto LAB_001234ad;
          }
        }
        psVar369 = (secp256k1_gej *)((long)psVar372 * (long)psVar379);
        lVar358 = (long)psVar370 * (long)psVar380 - (long)psVar369;
        uVar356 = (ulong)((secp256k1_gej *)((long)psVar370 * (long)psVar380) < psVar369);
        uVar361 = SUB168(SEXT816((long)psVar370) * SEXT816((long)psVar380),8) -
                  SUB168(SEXT816((long)psVar372) * SEXT816((long)psVar379),8);
        psVar357 = &secp256k1_const_modinfo_fe;
        psVar351 = (secp256k1_gej *)auStack_3e8;
        sStack_388.u = (int64_t)psVar370;
        sStack_388.v = (int64_t)psVar372;
        sStack_388.q = (int64_t)psVar379;
        sStack_388.r = (int64_t)psVar380;
        if ((lVar358 != 0x4000000000000000 || uVar361 != uVar356) &&
           (uVar361 - uVar356 != -1 || lVar358 != -0x4000000000000000)) {
LAB_001234ad:
          psStack_430 = (secp256k1_gej *)0x1234b2;
          secp256k1_fe_is_square_var_cold_16();
          psVar382 = psVar370;
LAB_001234b2:
          psStack_430 = (secp256k1_gej *)0x1234b7;
          secp256k1_fe_is_square_var_cold_15();
LAB_001234b7:
          psStack_430 = (secp256k1_gej *)0x1234bc;
          secp256k1_fe_is_square_var_cold_14();
LAB_001234bc:
          psStack_430 = (secp256k1_gej *)0x1234c1;
          secp256k1_fe_is_square_var_cold_13();
LAB_001234c1:
          psStack_430 = (secp256k1_gej *)0x1234c6;
          secp256k1_fe_is_square_var_cold_12();
LAB_001234c6:
          psStack_430 = (secp256k1_gej *)0x1234cb;
          secp256k1_fe_is_square_var_cold_11();
LAB_001234cb:
          psStack_430 = (secp256k1_gej *)0x1234d0;
          secp256k1_fe_is_square_var_cold_10();
LAB_001234d0:
          psStack_430 = (secp256k1_gej *)0x1234d5;
          secp256k1_fe_is_square_var_cold_9();
LAB_001234d5:
          psStack_430 = (secp256k1_gej *)0x1234da;
          secp256k1_fe_is_square_var_cold_8();
          goto LAB_001234da;
        }
        iVar367 = (int)psVar382;
        psStack_430 = (secp256k1_gej *)0x12326e;
        psVar365 = psVar382;
        psVar369 = psVar351;
        iVar360 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar351,iVar367,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar360 < 1) goto LAB_001234b2;
        psStack_430 = (secp256k1_gej *)0x123289;
        psVar365 = psVar382;
        psVar369 = psVar351;
        iVar360 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar351,iVar367,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (0 < iVar360) goto LAB_001234b7;
        psVar380 = (secp256k1_gej *)auStack_410;
        psStack_430 = (secp256k1_gej *)0x1232a6;
        psVar365 = psVar382;
        psVar369 = psVar380;
        iVar360 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar380,iVar367,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar360 < 1) goto LAB_001234bc;
        psStack_430 = (secp256k1_gej *)0x1232c1;
        psVar365 = psVar382;
        psVar369 = psVar380;
        iVar360 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar380,iVar367,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (-1 < iVar360) goto LAB_001234c1;
        psStack_430 = (secp256k1_gej *)0x1232df;
        secp256k1_modinv64_update_fg_62_var
                  (iVar367,(secp256k1_modinv64_signed62 *)psVar351,
                   (secp256k1_modinv64_signed62 *)psVar380,&sStack_388);
        psVar380 = (secp256k1_gej *)auStack_3e8._0_8_;
        if ((secp256k1_gej *)auStack_3e8._0_8_ == (secp256k1_gej *)0x1) {
          if (1 < iVar367) {
            psVar365 = (secp256k1_gej *)0x1;
            uVar356 = 0;
            do {
              uVar356 = uVar356 | *(ulong *)(auStack_3e8 + (long)psVar365 * 8);
              psVar365 = (secp256k1_gej *)((long)(psVar365->x).n + 1);
            } while (psVar382 != psVar365);
            if (uVar356 != 0) goto LAB_00123314;
          }
          psVar381 = (secp256k1_gej *)(ulong)(~uVar359 & 1);
          goto LAB_001233cb;
        }
LAB_00123314:
        lVar358 = (long)iVar367;
        if ((-1 < lVar358 + -2 && *(long *)(auStack_3e8 + lVar358 * 8 + -8) == 0) &&
            (&psStack_418)[lVar358] == (secp256k1_gej *)0x0) {
          psVar382 = (secp256k1_gej *)(ulong)(iVar367 - 1);
        }
        psStack_430 = (secp256k1_gej *)0x123341;
        iVar367 = (int)psVar382;
        psVar365 = psVar382;
        psVar369 = psVar351;
        iVar360 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar351,iVar367,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar360 < 1) goto LAB_001234c6;
        psStack_430 = (secp256k1_gej *)0x12335c;
        psVar365 = psVar382;
        psVar369 = psVar351;
        iVar360 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar351,iVar367,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (0 < iVar360) goto LAB_001234cb;
        psVar351 = (secp256k1_gej *)auStack_410;
        psStack_430 = (secp256k1_gej *)0x123379;
        psVar365 = psVar382;
        psVar369 = psVar351;
        iVar360 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar351,iVar367,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar360 < 1) goto LAB_001234d0;
        psStack_430 = (secp256k1_gej *)0x123394;
        psVar365 = psVar382;
        psVar369 = psVar351;
        iVar360 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar351,iVar367,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (-1 < iVar360) goto LAB_001234d5;
        uVar359 = (int)uStack_420 + 1;
        uVar356 = (ulong)uVar359;
      } while (uVar359 != 0xc);
      psStack_430 = (secp256k1_gej *)0x1233bb;
      uVar359 = secp256k1_fe_sqrt((secp256k1_fe *)auStack_3e8,(secp256k1_fe *)(auStack_3e8 + 0x30));
      psVar381 = (secp256k1_gej *)(ulong)uVar359;
    }
LAB_001233cb:
    psVar382 = (secp256k1_gej *)auStack_368;
    psStack_430 = (secp256k1_gej *)0x1233db;
    secp256k1_fe_verify((secp256k1_fe *)psVar382);
    auStack_368._0_8_ = ((ulong)auStack_368._32_8_ >> 0x30) * 0x1000003d1 + auStack_368._0_8_;
    auStack_368._8_8_ = ((ulong)auStack_368._0_8_ >> 0x34) + auStack_368._8_8_;
    auStack_368._16_8_ = ((ulong)auStack_368._8_8_ >> 0x34) + auStack_368._16_8_;
    uVar356 = ((ulong)auStack_368._16_8_ >> 0x34) + auStack_368._24_8_;
    auStack_368._24_8_ = uVar356 & 0xfffffffffffff;
    auStack_368._32_8_ = (uVar356 >> 0x34) + (auStack_368._32_8_ & 0xffffffffffff);
    auStack_368._16_8_ = auStack_368._16_8_ & 0xfffffffffffff;
    auStack_368._8_8_ = auStack_368._8_8_ & 0xfffffffffffff;
    auStack_368._0_8_ = auStack_368._0_8_ & 0xfffffffffffff;
    auStack_368._40_4_ = 1;
    psStack_430 = (secp256k1_gej *)0x123465;
    secp256k1_fe_verify((secp256k1_fe *)psVar382);
    psVar369 = (secp256k1_gej *)(auStack_3e8 + 0x30);
    psStack_430 = (secp256k1_gej *)0x123472;
    psVar365 = psVar382;
    iVar360 = secp256k1_fe_sqrt((secp256k1_fe *)psVar369,(secp256k1_fe *)psVar382);
    if ((int)psVar381 == iVar360) {
      return;
    }
  }
  psStack_430 = (secp256k1_gej *)secp256k1_ge_x_frac_on_curve_var;
  secp256k1_fe_is_square_var_cold_18();
  a_00 = (secp256k1_fe *)0xfffffffffffff;
  psVar372 = (secp256k1_gej *)0x1000003d0;
  psStack_4e8 = (secp256k1_gej *)0x12351c;
  psStack_458 = psVar381;
  psStack_450 = psVar351;
  psStack_448 = psVar380;
  psStack_440 = psVar382;
  psStack_438 = (secp256k1_gej *)psVar357;
  psStack_430 = psVar349;
  secp256k1_fe_verify(&psVar365->x);
  uVar356 = (psVar365->x).n[4];
  uVar361 = (uVar356 >> 0x30) * 0x1000003d1 + (psVar365->x).n[0];
  if (((uVar361 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar361 & 0xfffffffffffff) == 0)) {
    uVar362 = (uVar361 >> 0x34) + (psVar365->x).n[1];
    psVar382 = (secp256k1_gej *)((uVar362 >> 0x34) + (psVar365->x).n[2]);
    psVar381 = (secp256k1_gej *)(((ulong)psVar382 >> 0x34) + (psVar365->x).n[3]);
    uVar356 = ((ulong)psVar381 >> 0x34) + (uVar356 & 0xffffffffffff);
    if ((((uVar362 | uVar361 | (ulong)psVar382 | (ulong)psVar381) & 0xfffffffffffff) != 0 ||
         uVar356 != 0) &&
       (((uVar361 | 0x1000003d0) & uVar362 & (ulong)psVar382 & (ulong)psVar381 &
        (uVar356 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_001235c2;
    psStack_4e8 = (secp256k1_gej *)0x123d98;
    secp256k1_ge_x_frac_on_curve_var_cold_1();
LAB_00123d98:
    psStack_4e8 = (secp256k1_gej *)0x123d9d;
    secp256k1_ge_x_frac_on_curve_var_cold_6();
LAB_00123d9d:
    psStack_4e8 = (secp256k1_gej *)0x123da2;
    secp256k1_ge_x_frac_on_curve_var_cold_5();
LAB_00123da2:
    psVar377 = psVar380;
    psVar349 = psVar351;
    psStack_4e8 = (secp256k1_gej *)0x123da7;
    secp256k1_ge_x_frac_on_curve_var_cold_4();
LAB_00123da7:
    psStack_4e8 = (secp256k1_gej *)0x123dac;
    secp256k1_ge_x_frac_on_curve_var_cold_3();
  }
  else {
LAB_001235c2:
    psStack_4e8 = (secp256k1_gej *)0x1235d2;
    psVar382 = psVar365;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_4c0 + 0x30),&psVar365->x,&psVar369->x);
    psStack_4e8 = (secp256k1_gej *)0x1235da;
    psVar381 = psVar369;
    secp256k1_fe_verify(&psVar369->x);
    if (8 < (psVar369->x).magnitude) goto LAB_00123d98;
    a_00 = (secp256k1_fe *)auStack_4c0;
    uVar356 = (psVar369->x).n[0];
    uVar361 = (psVar369->x).n[1];
    psVar351 = (secp256k1_gej *)(psVar369->x).n[2];
    psVar380 = (secp256k1_gej *)(psVar369->x).n[3];
    uVar362 = (psVar369->x).n[4];
    psVar372 = (secp256k1_gej *)0xfffffffffffff;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar356 * 2;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = psVar380;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar361 * 2;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = psVar351;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar362;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = uVar362;
    uVar363 = SUB168(auVar26 * auVar182,0);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar363 & 0xfffffffffffff;
    auVar4 = auVar25 * auVar181 + auVar24 * auVar180 + auVar27 * ZEXT816(0x1000003d10);
    uVar368 = auVar4._0_8_;
    uStack_4c8 = uVar368 & 0xfffffffffffff;
    auVar299._8_8_ = 0;
    auVar299._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar362 = uVar362 * 2;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar356;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = uVar362;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar361 * 2;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = psVar380;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = psVar351;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = psVar351;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar363 >> 0x34 | SUB168(auVar26 * auVar182,8) << 0xc;
    auVar4 = auVar28 * auVar183 + auVar299 + auVar29 * auVar184 + auVar30 * auVar185 +
             auVar31 * ZEXT816(0x1000003d10);
    uVar363 = auVar4._0_8_;
    auVar300._8_8_ = 0;
    auVar300._0_8_ = uVar363 >> 0x34 | auVar4._8_8_ << 0xc;
    uStack_4d8 = (uVar363 & 0xfffffffffffff) >> 0x30;
    psStack_4d0 = (secp256k1_gej *)(uVar363 & 0xffffffffffff);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar356;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = uVar356;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar361;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = uVar362;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = (long)psVar351 * 2;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = psVar380;
    auVar4 = auVar33 * auVar187 + auVar300 + auVar34 * auVar188;
    uVar363 = auVar4._0_8_;
    auVar302._8_8_ = 0;
    auVar302._0_8_ = uVar363 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = (uVar363 & 0xfffffffffffff) << 4 | uStack_4d8;
    auVar4 = auVar32 * auVar186 + ZEXT816(0x1000003d1) * auVar189;
    uVar363 = auVar4._0_8_;
    auStack_4c0._0_8_ = uVar363 & 0xfffffffffffff;
    auVar301._8_8_ = 0;
    auVar301._0_8_ = uVar363 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar356 * 2;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uVar361;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = psVar351;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar362;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = psVar380;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = psVar380;
    auVar5 = auVar36 * auVar191 + auVar302 + auVar37 * auVar192;
    uVar363 = auVar5._0_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar363 & 0xfffffffffffff;
    auVar4 = auVar35 * auVar190 + auVar301 + auVar38 * ZEXT816(0x1000003d10);
    uVar368 = auVar4._0_8_;
    auVar304._8_8_ = 0;
    auVar304._0_8_ = uVar363 >> 0x34 | auVar5._8_8_ << 0xc;
    auStack_4c0._8_8_ = uVar368 & 0xfffffffffffff;
    auVar303._8_8_ = 0;
    auVar303._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar356 * 2;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = psVar351;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar361;
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar361;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = psVar380;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar362;
    auVar304 = auVar41 * auVar195 + auVar304;
    uVar356 = auVar304._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar39 * auVar193 + auVar303 + auVar40 * auVar194 + auVar42 * ZEXT816(0x1000003d10);
    uVar361 = auVar4._0_8_;
    auStack_4c0._16_8_ = uVar361 & 0xfffffffffffff;
    auVar305._8_8_ = 0;
    auVar305._0_8_ = (uVar361 >> 0x34 | auVar4._8_8_ << 0xc) + uStack_4c8;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar356 >> 0x34 | auVar304._8_8_ << 0xc;
    auVar305 = auVar43 * ZEXT816(0x1000003d10) + auVar305;
    uVar356 = auVar305._0_8_;
    auStack_4c0._24_8_ = uVar356 & 0xfffffffffffff;
    auStack_4c0._32_8_ = (long)(psStack_4d0->x).n + (uVar356 >> 0x34 | auVar305._8_8_ << 0xc);
    auStack_4c0._40_8_ = 1;
    psStack_4e8 = (secp256k1_gej *)0x123824;
    secp256k1_fe_verify(a_00);
    psVar382 = (secp256k1_gej *)(auStack_4c0 + 0x30);
    psStack_4e8 = (secp256k1_gej *)0x123834;
    secp256k1_fe_mul((secp256k1_fe *)psVar382,(secp256k1_fe *)psVar382,a_00);
    psStack_4e8 = (secp256k1_gej *)0x12383c;
    psVar381 = psVar365;
    secp256k1_fe_verify(&psVar365->x);
    psVar369 = psVar365;
    if (8 < (psVar365->x).magnitude) goto LAB_00123d9d;
    uVar356 = (psVar365->x).n[0];
    uVar361 = (psVar365->x).n[1];
    psVar351 = (secp256k1_gej *)(psVar365->x).n[2];
    psVar380 = (secp256k1_gej *)(psVar365->x).n[3];
    uVar362 = (psVar365->x).n[4];
    psVar372 = (secp256k1_gej *)0xfffffffffffff;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar356 * 2;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = psVar380;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar361 * 2;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = psVar351;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar362;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uVar362;
    uVar363 = SUB168(auVar46 * auVar198,0);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar363 & 0xfffffffffffff;
    auVar4 = auVar45 * auVar197 + auVar44 * auVar196 + auVar47 * ZEXT816(0x1000003d10);
    uVar368 = auVar4._0_8_;
    uStack_4c8 = uVar368 & 0xfffffffffffff;
    auVar306._8_8_ = 0;
    auVar306._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
    a_00 = (secp256k1_fe *)(uVar362 * 2);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar356;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = a_00;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar361 * 2;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = psVar380;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = psVar351;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = psVar351;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar363 >> 0x34 | SUB168(auVar46 * auVar198,8) << 0xc;
    auVar4 = auVar48 * auVar199 + auVar306 + auVar49 * auVar200 + auVar50 * auVar201 +
             auVar51 * ZEXT816(0x1000003d10);
    uVar362 = auVar4._0_8_;
    auVar307._8_8_ = 0;
    auVar307._0_8_ = uVar362 >> 0x34 | auVar4._8_8_ << 0xc;
    uStack_4d8 = (uVar362 & 0xfffffffffffff) >> 0x30;
    psVar382 = (secp256k1_gej *)(uVar362 & 0xffffffffffff);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar356;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uVar356;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar361;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = a_00;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = (long)psVar351 * 2;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = psVar380;
    auVar4 = auVar53 * auVar203 + auVar307 + auVar54 * auVar204;
    uVar362 = auVar4._0_8_;
    auVar309._8_8_ = 0;
    auVar309._0_8_ = uVar362 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = (uVar362 & 0xfffffffffffff) << 4 | uStack_4d8;
    auVar4 = auVar52 * auVar202 + ZEXT816(0x1000003d1) * auVar205;
    uVar362 = auVar4._0_8_;
    auStack_4c0._0_8_ = uVar362 & 0xfffffffffffff;
    auVar308._8_8_ = 0;
    auVar308._0_8_ = uVar362 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar356 * 2;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar361;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = psVar351;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = a_00;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = psVar380;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = psVar380;
    auVar5 = auVar56 * auVar207 + auVar309 + auVar57 * auVar208;
    uVar362 = auVar5._0_8_;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar362 & 0xfffffffffffff;
    auVar4 = auVar55 * auVar206 + auVar308 + auVar58 * ZEXT816(0x1000003d10);
    uVar363 = auVar4._0_8_;
    auVar311._8_8_ = 0;
    auVar311._0_8_ = uVar362 >> 0x34 | auVar5._8_8_ << 0xc;
    auStack_4c0._8_8_ = uVar363 & 0xfffffffffffff;
    auVar310._8_8_ = 0;
    auVar310._0_8_ = uVar363 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar356 * 2;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = psVar351;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar361;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar361;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = psVar380;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = a_00;
    auVar311 = auVar61 * auVar211 + auVar311;
    uVar356 = auVar311._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar59 * auVar209 + auVar310 + auVar60 * auVar210 + auVar62 * ZEXT816(0x1000003d10);
    uVar361 = auVar4._0_8_;
    psVar369 = (secp256k1_gej *)(uVar356 >> 0x34 | auVar311._8_8_ << 0xc);
    auStack_4c0._16_8_ = uVar361 & 0xfffffffffffff;
    auVar312._8_8_ = 0;
    auVar312._0_8_ = (uVar361 >> 0x34 | auVar4._8_8_ << 0xc) + uStack_4c8;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = psVar369;
    auVar312 = auVar63 * ZEXT816(0x1000003d10) + auVar312;
    uVar356 = auVar312._0_8_;
    auStack_4c0._24_8_ = uVar356 & 0xfffffffffffff;
    auStack_4c0._32_8_ = (long)(psVar382->x).n + (uVar356 >> 0x34 | auVar312._8_8_ << 0xc);
    auStack_4c0._40_8_ = 1;
    psStack_4e8 = (secp256k1_gej *)0x123a83;
    psStack_4d0 = psVar382;
    secp256k1_fe_verify((secp256k1_fe *)auStack_4c0);
    psStack_4e8 = (secp256k1_gej *)0x123a8b;
    psVar381 = (secp256k1_gej *)auStack_4c0;
    secp256k1_fe_verify((secp256k1_fe *)auStack_4c0);
    psVar377 = (secp256k1_gej *)auStack_4c0._24_8_;
    psVar349 = (secp256k1_gej *)auStack_4c0._16_8_;
    psVar365 = (secp256k1_gej *)auStack_4c0;
    if (8 < (int)auStack_4c0._40_4_) goto LAB_00123da2;
    psVar372 = (secp256k1_gej *)0xfffffffffffff;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = auStack_4c0._0_8_ * 2;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = auStack_4c0._24_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = auStack_4c0._8_8_ * 2;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = auStack_4c0._16_8_;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = auStack_4c0._32_8_;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = auStack_4c0._32_8_;
    uVar356 = SUB168(auVar66 * auVar214,0);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar65 * auVar213 + auVar64 * auVar212 + auVar67 * ZEXT816(0x1000003d10);
    uVar361 = auVar4._0_8_;
    uStack_4c8 = uVar361 & 0xfffffffffffff;
    auVar313._8_8_ = 0;
    auVar313._0_8_ = uVar361 >> 0x34 | auVar4._8_8_ << 0xc;
    a_00 = (secp256k1_fe *)(auStack_4c0._32_8_ * 2);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auStack_4c0._0_8_;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = a_00;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auStack_4c0._8_8_ * 2;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = auStack_4c0._24_8_;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auStack_4c0._16_8_;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = auStack_4c0._16_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar356 >> 0x34 | SUB168(auVar66 * auVar214,8) << 0xc;
    auVar4 = auVar68 * auVar215 + auVar313 + auVar69 * auVar216 + auVar70 * auVar217 +
             auVar71 * ZEXT816(0x1000003d10);
    uVar356 = auVar4._0_8_;
    auVar314._8_8_ = 0;
    auVar314._0_8_ = uVar356 >> 0x34 | auVar4._8_8_ << 0xc;
    uStack_4d8 = (uVar356 & 0xfffffffffffff) >> 0x30;
    psVar382 = (secp256k1_gej *)(uVar356 & 0xffffffffffff);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auStack_4c0._0_8_;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = auStack_4c0._0_8_;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auStack_4c0._8_8_;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = a_00;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = auStack_4c0._16_8_ * 2;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = auStack_4c0._24_8_;
    auVar4 = auVar73 * auVar219 + auVar314 + auVar74 * auVar220;
    uVar356 = auVar4._0_8_;
    auVar316._8_8_ = 0;
    auVar316._0_8_ = uVar356 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = (uVar356 & 0xfffffffffffff) << 4 | uStack_4d8;
    auVar4 = auVar72 * auVar218 + ZEXT816(0x1000003d1) * auVar221;
    uVar361 = auVar4._0_8_;
    auVar315._8_8_ = 0;
    auVar315._0_8_ = uVar361 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auStack_4c0._0_8_ * 2;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = auStack_4c0._8_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auStack_4c0._16_8_;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = a_00;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = auStack_4c0._24_8_;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = auStack_4c0._24_8_;
    auVar5 = auVar76 * auVar223 + auVar316 + auVar77 * auVar224;
    uVar356 = auVar5._0_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar75 * auVar222 + auVar315 + auVar78 * ZEXT816(0x1000003d10);
    uVar362 = auVar4._0_8_;
    auVar318._8_8_ = 0;
    auVar318._0_8_ = uVar356 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar317._8_8_ = 0;
    auVar317._0_8_ = uVar362 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = auStack_4c0._0_8_ * 2;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = auStack_4c0._16_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = auStack_4c0._8_8_;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = auStack_4c0._8_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = auStack_4c0._24_8_;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = a_00;
    auVar318 = auVar81 * auVar227 + auVar318;
    uVar356 = auVar318._0_8_;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar79 * auVar225 + auVar317 + auVar80 * auVar226 + auVar82 * ZEXT816(0x1000003d10);
    uVar363 = auVar4._0_8_;
    psVar369 = (secp256k1_gej *)(uVar356 >> 0x34 | auVar318._8_8_ << 0xc);
    auStack_4c0._16_8_ = uVar363 & 0xfffffffffffff;
    auVar319._8_8_ = 0;
    auVar319._0_8_ = (uVar363 >> 0x34 | auVar4._8_8_ << 0xc) + uStack_4c8;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = psVar369;
    auVar319 = auVar83 * ZEXT816(0x1000003d10) + auVar319;
    uVar356 = auVar319._0_8_;
    auStack_4c0._24_8_ = uVar356 & 0xfffffffffffff;
    auStack_4c0._32_8_ = (long)(psVar382->x).n + (uVar356 >> 0x34 | auVar319._8_8_ << 0xc);
    auStack_4c0._40_8_ = 1;
    psStack_4e8 = (secp256k1_gej *)0x123cce;
    psStack_4d0 = psVar382;
    auStack_4c0._0_8_ = uVar361 & 0xfffffffffffff;
    auStack_4c0._8_8_ = uVar362 & 0xfffffffffffff;
    secp256k1_fe_verify((secp256k1_fe *)auStack_4c0);
    psStack_4e8 = (secp256k1_gej *)0x123cd6;
    psVar381 = (secp256k1_gej *)auStack_4c0;
    secp256k1_fe_verify((secp256k1_fe *)auStack_4c0);
    if (0x10 < (int)auStack_4c0._40_4_) goto LAB_00123da7;
    psVar369 = (secp256k1_gej *)auStack_4c0;
    auStack_4c0._0_8_ = auStack_4c0._0_8_ * 2;
    auStack_4c0._8_8_ = auStack_4c0._8_8_ * 2;
    auStack_4c0._16_8_ = auStack_4c0._16_8_ * 2;
    auStack_4c0._24_8_ = auStack_4c0._24_8_ * 2;
    auStack_4c0._32_8_ = auStack_4c0._32_8_ << 1;
    auStack_4c0._44_4_ = 0;
    auStack_4c0._40_4_ = auStack_4c0._40_4_ * 2;
    psStack_4e8 = (secp256k1_gej *)0x123d1a;
    secp256k1_fe_verify((secp256k1_fe *)psVar369);
    a_00 = (secp256k1_fe *)(auStack_4c0 + 0x30);
    psStack_4e8 = (secp256k1_gej *)0x123d27;
    secp256k1_fe_verify(a_00);
    psStack_4e8 = (secp256k1_gej *)0x123d2f;
    psVar381 = psVar369;
    secp256k1_fe_verify((secp256k1_fe *)psVar369);
    iStack_468 = auStack_4c0._40_4_ + iStack_468;
    if (iStack_468 < 0x21) {
      auStack_4c0._48_8_ = auStack_4c0._48_8_ + auStack_4c0._0_8_;
      uStack_488 = uStack_488 + auStack_4c0._8_8_;
      uStack_480 = (long)((secp256k1_fe *)auStack_4c0._16_8_)->n + uStack_480;
      uStack_478 = (long)((secp256k1_fe *)auStack_4c0._24_8_)->n + uStack_478;
      uStack_470 = uStack_470 + auStack_4c0._32_8_;
      iStack_464 = 0;
      psStack_4e8 = (secp256k1_gej *)0x123d79;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_4c0 + 0x30));
      psStack_4e8 = (secp256k1_gej *)0x123d81;
      secp256k1_fe_is_square_var((secp256k1_fe *)(auStack_4c0 + 0x30));
      return;
    }
  }
  psStack_4e8 = (secp256k1_gej *)secp256k1_gej_add_var;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psStack_7c0 = (secp256k1_gej *)0x123dd3;
  psVar380 = psVar382;
  psStack_510 = psVar369;
  psStack_508 = psVar349;
  psStack_500 = psVar377;
  psStack_4f8 = a_00;
  psStack_4f0 = psVar372;
  psStack_4e8 = psVar365;
  secp256k1_gej_verify(psVar382);
  psStack_7c0 = (secp256k1_gej *)0x123ddb;
  secp256k1_gej_verify(a);
  psVar365 = a;
  if ((psVar382->infinity != 0) || (psVar365 = psVar382, a->infinity != 0)) {
    memcpy(psVar381,psVar365,0x98);
    return;
  }
  psVar365 = (secp256k1_gej *)&a->z;
  psStack_7c0 = (secp256k1_gej *)0x123e32;
  psVar351 = psVar365;
  psStack_7b0 = psVar381;
  psStack_7a8 = psVar382;
  secp256k1_fe_verify((secp256k1_fe *)psVar365);
  if ((a->z).magnitude < 9) {
    uVar356 = ((secp256k1_fe *)psVar365)->n[0];
    uVar361 = (a->z).n[1];
    psVar349 = (secp256k1_gej *)(a->z).n[2];
    psVar377 = (secp256k1_gej *)(a->z).n[3];
    uVar362 = (a->z).n[4];
    psVar372 = (secp256k1_gej *)0xfffffffffffff;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar356 * 2;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = psVar377;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar361 * 2;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = psVar349;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar362;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = uVar362;
    uVar363 = SUB168(auVar86 * auVar230,0);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar363 & 0xfffffffffffff;
    auVar4 = auVar85 * auVar229 + auVar84 * auVar228 + auVar87 * ZEXT816(0x1000003d10);
    uVar368 = auVar4._0_8_;
    auStack_5a8._56_8_ = uVar368 & 0xfffffffffffff;
    auVar320._8_8_ = 0;
    auVar320._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar362 = uVar362 * 2;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar356;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = uVar362;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar361 * 2;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = psVar377;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = psVar349;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = psVar349;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar363 >> 0x34 | SUB168(auVar86 * auVar230,8) << 0xc;
    auVar4 = auVar88 * auVar231 + auVar320 + auVar89 * auVar232 + auVar90 * auVar233 +
             auVar91 * ZEXT816(0x1000003d10);
    uVar363 = auVar4._0_8_;
    auVar321._8_8_ = 0;
    auVar321._0_8_ = uVar363 >> 0x34 | auVar4._8_8_ << 0xc;
    auStack_6d8._0_8_ = (uVar363 & 0xfffffffffffff) >> 0x30;
    psVar380 = (secp256k1_gej *)(uVar363 & 0xffffffffffff);
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar356;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = uVar356;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar361;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = uVar362;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = (long)psVar349 * 2;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = psVar377;
    auVar4 = auVar93 * auVar235 + auVar321 + auVar94 * auVar236;
    uVar363 = auVar4._0_8_;
    auVar323._8_8_ = 0;
    auVar323._0_8_ = uVar363 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = (uVar363 & 0xfffffffffffff) << 4 | auStack_6d8._0_8_;
    auVar4 = auVar92 * auVar234 + ZEXT816(0x1000003d1) * auVar237;
    uVar363 = auVar4._0_8_;
    sStack_540.n[0] = uVar363 & 0xfffffffffffff;
    auVar322._8_8_ = 0;
    auVar322._0_8_ = uVar363 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar356 * 2;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = uVar361;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = psVar349;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar362;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = psVar377;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = psVar377;
    auVar5 = auVar96 * auVar239 + auVar323 + auVar97 * auVar240;
    uVar363 = auVar5._0_8_;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar363 & 0xfffffffffffff;
    auVar4 = auVar95 * auVar238 + auVar322 + auVar98 * ZEXT816(0x1000003d10);
    uVar368 = auVar4._0_8_;
    auVar325._8_8_ = 0;
    auVar325._0_8_ = uVar363 >> 0x34 | auVar5._8_8_ << 0xc;
    sStack_540.n[1] = uVar368 & 0xfffffffffffff;
    auVar324._8_8_ = 0;
    auVar324._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar356 * 2;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = psVar349;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar361;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = uVar361;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = psVar377;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = uVar362;
    auVar325 = auVar101 * auVar243 + auVar325;
    uVar356 = auVar325._0_8_;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar99 * auVar241 + auVar324 + auVar100 * auVar242 + auVar102 * ZEXT816(0x1000003d10);
    uVar361 = auVar4._0_8_;
    sStack_540.n[2] = uVar361 & 0xfffffffffffff;
    auVar326._8_8_ = 0;
    auVar326._0_8_ = (uVar361 >> 0x34 | auVar4._8_8_ << 0xc) + auStack_5a8._56_8_;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar356 >> 0x34 | auVar325._8_8_ << 0xc;
    auVar326 = auVar103 * ZEXT816(0x1000003d10) + auVar326;
    uVar356 = auVar326._0_8_;
    sStack_540.n[3] = uVar356 & 0xfffffffffffff;
    sStack_540.n[4] = (long)(psVar380->x).n + (uVar356 >> 0x34 | auVar326._8_8_ << 0xc);
    sStack_540.magnitude = 1;
    sStack_540.normalized = 0;
    psStack_7c0 = (secp256k1_gej *)0x124093;
    psStack_790 = (secp256k1_fe *)psVar365;
    auStack_6d8._48_8_ = psVar380;
    secp256k1_fe_verify(&sStack_540);
    psVar382 = psStack_7a8;
    psVar365 = (secp256k1_gej *)&psStack_7a8->z;
    psStack_7c0 = (secp256k1_gej *)0x1240a4;
    psVar351 = psVar365;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    if (8 < (psVar382->z).magnitude) goto LAB_00124f4e;
    psVar349 = (secp256k1_gej *)(auStack_5a8 + 0x38);
    uVar356 = ((secp256k1_fe *)psVar365)->n[0];
    uVar361 = (psVar382->z).n[1];
    uVar362 = (psVar382->z).n[2];
    psVar377 = (secp256k1_gej *)(psVar382->z).n[3];
    uVar363 = (psVar382->z).n[4];
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar356 * 2;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = psVar377;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar361 * 2;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = uVar362;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar363;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar363;
    uVar368 = SUB168(auVar106 * auVar246,0);
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar368 & 0xfffffffffffff;
    auVar4 = auVar105 * auVar245 + auVar104 * auVar244 + auVar107 * ZEXT816(0x1000003d10);
    uVar350 = auVar4._0_8_;
    auStack_6d8._48_8_ = uVar350 & 0xfffffffffffff;
    auVar327._8_8_ = 0;
    auVar327._0_8_ = uVar350 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar363 = uVar363 * 2;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar356;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = uVar363;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar361 * 2;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = psVar377;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar362;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = uVar362;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar368 >> 0x34 | SUB168(auVar106 * auVar246,8) << 0xc;
    auVar4 = auVar108 * auVar247 + auVar327 + auVar109 * auVar248 + auVar110 * auVar249 +
             auVar111 * ZEXT816(0x1000003d10);
    auStack_6d8._0_8_ = auVar4._0_8_;
    auVar328._8_8_ = 0;
    auVar328._0_8_ = (ulong)auStack_6d8._0_8_ >> 0x34 | auVar4._8_8_ << 0xc;
    auStack_738._48_8_ = (auStack_6d8._0_8_ & 0xfffffffffffff) >> 0x30;
    auStack_6d8._0_8_ = auStack_6d8._0_8_ & 0xffffffffffff;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar356;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = uVar356;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar361;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = uVar363;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar362 * 2;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = psVar377;
    auVar4 = auVar113 * auVar251 + auVar328 + auVar114 * auVar252;
    uVar368 = auVar4._0_8_;
    auVar330._8_8_ = 0;
    auVar330._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = (uVar368 & 0xfffffffffffff) << 4 | auStack_738._48_8_;
    auVar4 = auVar112 * auVar250 + ZEXT816(0x1000003d1) * auVar253;
    uVar368 = auVar4._0_8_;
    auStack_5a8._56_8_ = uVar368 & 0xfffffffffffff;
    auVar329._8_8_ = 0;
    auVar329._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar356 * 2;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar361;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar362;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = uVar363;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = psVar377;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = psVar377;
    auVar5 = auVar116 * auVar255 + auVar330 + auVar117 * auVar256;
    uVar368 = auVar5._0_8_;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar368 & 0xfffffffffffff;
    auVar4 = auVar115 * auVar254 + auVar329 + auVar118 * ZEXT816(0x1000003d10);
    uVar350 = auVar4._0_8_;
    auVar332._8_8_ = 0;
    auVar332._0_8_ = uVar368 >> 0x34 | auVar5._8_8_ << 0xc;
    uStack_568 = uVar350 & 0xfffffffffffff;
    auVar331._8_8_ = 0;
    auVar331._0_8_ = uVar350 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar356 * 2;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = uVar362;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar361;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uVar361;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = psVar377;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = uVar363;
    auVar332 = auVar121 * auVar259 + auVar332;
    uVar356 = auVar332._0_8_;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar119 * auVar257 + auVar331 + auVar120 * auVar258 + auVar122 * ZEXT816(0x1000003d10)
    ;
    uVar361 = auVar4._0_8_;
    uStack_560 = uVar361 & 0xfffffffffffff;
    auVar333._8_8_ = 0;
    auVar333._0_8_ =
         (long)(((secp256k1_gej *)auStack_6d8._48_8_)->x).n +
         (uVar361 >> 0x34 | auVar4._8_8_ << 0xc);
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uVar356 >> 0x34 | auVar332._8_8_ << 0xc;
    auVar333 = auVar123 * ZEXT816(0x1000003d10) + auVar333;
    uVar356 = auVar333._0_8_;
    uStack_558 = uVar356 & 0xfffffffffffff;
    lStack_550 = (uVar356 >> 0x34 | auVar333._8_8_ << 0xc) + auStack_6d8._0_8_;
    uStack_548 = 1;
    psStack_7c0 = (secp256k1_gej *)0x124309;
    psStack_798 = psVar365;
    secp256k1_fe_verify((secp256k1_fe *)psVar349);
    psVar382 = psStack_7a8;
    psVar365 = (secp256k1_gej *)(auStack_6d8 + 0x30);
    psStack_7c0 = (secp256k1_gej *)0x12432c;
    secp256k1_fe_mul((secp256k1_fe *)psVar365,&psStack_7a8->x,&sStack_540);
    psStack_7c0 = (secp256k1_gej *)0x12433f;
    secp256k1_fe_mul((secp256k1_fe *)auStack_6d8,&a->x,(secp256k1_fe *)psVar349);
    psVar372 = (secp256k1_gej *)(auStack_738 + 0x30);
    psStack_7c0 = (secp256k1_gej *)0x124356;
    secp256k1_fe_mul((secp256k1_fe *)psVar372,&psVar382->y,&sStack_540);
    psStack_7c0 = (secp256k1_gej *)0x124366;
    secp256k1_fe_mul((secp256k1_fe *)psVar372,(secp256k1_fe *)psVar372,psStack_790);
    psVar382 = (secp256k1_gej *)auStack_678;
    psStack_7c0 = (secp256k1_gej *)0x124380;
    secp256k1_fe_mul((secp256k1_fe *)psVar382,&a->y,(secp256k1_fe *)psVar349);
    psStack_7c0 = (secp256k1_gej *)0x124390;
    psVar380 = psVar382;
    secp256k1_fe_mul((secp256k1_fe *)psVar382,(secp256k1_fe *)psVar382,&psStack_798->x);
    psStack_7c0 = (secp256k1_gej *)0x124398;
    psVar351 = psVar365;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    if (1 < iStack_680) goto LAB_00124f53;
    psVar372 = (secp256k1_gej *)(0x3ffffbfffff0bc - auStack_6d8._48_8_);
    psVar349 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_6a0);
    psVar377 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_698);
    psVar382 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_690);
    uStack_5b0 = 2;
    psStack_7c0 = (secp256k1_gej *)0x124419;
    auStack_608._48_8_ = psVar372;
    psStack_5d0 = psVar349;
    psStack_5c8 = psVar377;
    psStack_5c0 = psVar382;
    uStack_5b8 = 0x3fffffffffffc - uStack_688;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_608 + 0x30));
    psStack_7c0 = (secp256k1_gej *)0x124421;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_608 + 0x30));
    psVar365 = (secp256k1_gej *)auStack_6d8;
    psStack_7c0 = (secp256k1_gej *)0x124431;
    psVar351 = psVar365;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    if (0x1e < (int)auStack_6d8._40_4_) goto LAB_00124f58;
    psVar372 = (secp256k1_gej *)((long)(psVar372->x).n + auStack_6d8._0_8_);
    psVar349 = (secp256k1_gej *)((long)(psVar349->x).n + auStack_6d8._8_8_);
    psVar377 = (secp256k1_gej *)((long)(psVar377->x).n + auStack_6d8._16_8_);
    psVar382 = (secp256k1_gej *)((long)(psVar382->x).n + auStack_6d8._24_8_);
    uStack_7a0 = (0x3fffffffffffc - uStack_688) + auStack_6d8._32_8_;
    uStack_5b0 = (ulong)(auStack_6d8._40_4_ + 2);
    psStack_7c0 = (secp256k1_gej *)0x1244ab;
    psStack_768 = psVar377;
    psStack_760 = psVar382;
    psStack_758 = psVar372;
    psStack_750 = psVar349;
    auStack_608._48_8_ = psVar372;
    psStack_5d0 = psVar349;
    psStack_5c8 = psVar377;
    psStack_5c0 = psVar382;
    uStack_5b8 = uStack_7a0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_608 + 0x30));
    psVar365 = (secp256k1_gej *)auStack_678;
    psStack_7c0 = (secp256k1_gej *)0x1244bb;
    psVar351 = psVar365;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    if (1 < (int)auStack_678._40_4_) goto LAB_00124f5d;
    psVar382 = (secp256k1_gej *)(0x3ffffbfffff0bc - auStack_678._0_8_);
    psVar372 = (secp256k1_gej *)(0x3ffffffffffffc - auStack_678._8_8_);
    psVar349 = (secp256k1_gej *)(0x3ffffffffffffc - auStack_678._16_8_);
    psVar377 = (secp256k1_gej *)(0x3fffffffffffc - auStack_678._32_8_);
    auStack_608._40_8_ = 2;
    psStack_7c0 = (secp256k1_gej *)0x12453c;
    auStack_608._0_8_ = psVar382;
    auStack_608._8_8_ = psVar372;
    auStack_608._16_8_ = psVar349;
    auStack_608._24_8_ = (secp256k1_gej *)(0x3ffffffffffffc - auStack_678._24_8_);
    auStack_608._32_8_ = psVar377;
    secp256k1_fe_verify((secp256k1_fe *)auStack_608);
    psStack_7c0 = (secp256k1_gej *)0x124544;
    secp256k1_fe_verify((secp256k1_fe *)auStack_608);
    psVar365 = (secp256k1_gej *)(auStack_738 + 0x30);
    psStack_7c0 = (secp256k1_gej *)0x124554;
    psVar351 = psVar365;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    if (0x1e < (int)uStack_6e0) goto LAB_00124f62;
    psStack_778 = (secp256k1_gej *)((long)(psVar382->x).n + auStack_738._48_8_);
    psStack_780 = (secp256k1_gej *)((long)(psVar372->x).n + uStack_700);
    psVar349 = (secp256k1_gej *)((long)(psVar349->x).n + uStack_6f8);
    psVar382 = (secp256k1_gej *)
               ((long)(((secp256k1_gej *)(0x3ffffffffffffc - auStack_678._24_8_))->x).n + uStack_6f0
               );
    psVar377 = (secp256k1_gej *)((long)(psVar377->x).n + uStack_6e8);
    auStack_608._44_4_ = 0;
    auStack_608._40_4_ = uStack_6e0 + 2;
    psStack_7c0 = (secp256k1_gej *)0x1245d3;
    psStack_788 = psVar349;
    uStack_770 = (ulong)uStack_6e0;
    auStack_608._0_8_ = psStack_778;
    auStack_608._8_8_ = psStack_780;
    auStack_608._16_8_ = psVar349;
    auStack_608._24_8_ = psVar382;
    auStack_608._32_8_ = psVar377;
    secp256k1_fe_verify((secp256k1_fe *)auStack_608);
    psStack_7c0 = (secp256k1_gej *)0x1245e0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_608 + 0x30));
    psVar372 = psStack_7b0;
    uVar356 = (uStack_7a0 >> 0x30) * 0x1000003d1 + (long)psStack_758;
    if (((uVar356 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar356 & 0xfffffffffffff) == 0)) {
      uVar368 = (long)(psStack_750->x).n + (uVar356 >> 0x34);
      uVar361 = (long)(psStack_768->x).n + (uVar368 >> 0x34);
      uVar362 = (long)(psStack_760->x).n + (uVar361 >> 0x34);
      uVar363 = (uVar362 >> 0x34) + (uStack_7a0 & 0xffffffffffff);
      if ((((uVar368 | uVar356 | uVar361 | uVar362) & 0xfffffffffffff) == 0 && uVar363 == 0) ||
         (((uVar356 | 0x1000003d0) & uVar368 & uVar361 & uVar362 & (uVar363 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_7c0 = (secp256k1_gej *)0x124e86;
        secp256k1_fe_verify((secp256k1_fe *)auStack_608);
        uVar356 = ((ulong)psVar377 >> 0x30) * 0x1000003d1 + (long)psStack_778;
        if (((uVar356 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar356 & 0xfffffffffffff) == 0))
        {
          uVar368 = (long)(psStack_780->x).n + (uVar356 >> 0x34);
          uVar361 = (long)(psStack_788->x).n + (uVar368 >> 0x34);
          uVar362 = (long)(psVar382->x).n + (uVar361 >> 0x34);
          uVar363 = (uVar362 >> 0x34) + ((ulong)psVar377 & 0xffffffffffff);
          if ((((uVar368 | uVar356 | uVar361 | uVar362) & 0xfffffffffffff) == 0 && uVar363 == 0) ||
             (((uVar356 | 0x1000003d0) & uVar368 & uVar361 & uVar362 & (uVar363 ^ 0xf000000000000))
              == 0xfffffffffffff)) {
            psStack_7c0 = (secp256k1_gej *)0x124f37;
            secp256k1_gej_double_var(psStack_7b0,psStack_7a8,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_7c0 = (secp256k1_gej *)0x124f24;
        secp256k1_gej_set_infinity(psStack_7b0);
        return;
      }
    }
    psStack_7b0->infinity = 0;
    psVar382 = (secp256k1_gej *)(auStack_678 + 0x30);
    psVar365 = (secp256k1_gej *)(auStack_608 + 0x30);
    psStack_7c0 = (secp256k1_gej *)0x1246cf;
    secp256k1_fe_mul((secp256k1_fe *)psVar382,(secp256k1_fe *)psVar365,psStack_790);
    psStack_7c0 = (secp256k1_gej *)0x1246e0;
    psVar380 = psStack_798;
    secp256k1_fe_mul(&psVar372->z,&psStack_798->x,(secp256k1_fe *)psVar382);
    psStack_7c0 = (secp256k1_gej *)0x1246e8;
    psVar351 = psVar365;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    psVar369 = psStack_5c0;
    psVar381 = psStack_5c8;
    if (8 < (int)uStack_5b0) goto LAB_00124f67;
    psVar351 = (secp256k1_gej *)auStack_5a8;
    psVar372 = (secp256k1_gej *)0xfffffffffffff;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = auStack_608._48_8_ * 2;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = psStack_5c0;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = (long)psStack_5d0 * 2;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = psStack_5c8;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uStack_5b8;
    auVar262._8_8_ = 0;
    auVar262._0_8_ = uStack_5b8;
    uVar356 = SUB168(auVar126 * auVar262,0);
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar125 * auVar261 + auVar124 * auVar260 + auVar127 * ZEXT816(0x1000003d10);
    uVar361 = auVar4._0_8_;
    auStack_738._0_8_ = uVar361 & 0xfffffffffffff;
    auVar334._8_8_ = 0;
    auVar334._0_8_ = uVar361 >> 0x34 | auVar4._8_8_ << 0xc;
    psVar382 = (secp256k1_gej *)(uStack_5b8 * 2);
    auVar128._8_8_ = 0;
    auVar128._0_8_ = auStack_608._48_8_;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = psVar382;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = (long)psStack_5d0 * 2;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = psStack_5c0;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = psStack_5c8;
    auVar265._8_8_ = 0;
    auVar265._0_8_ = psStack_5c8;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = uVar356 >> 0x34 | SUB168(auVar126 * auVar262,8) << 0xc;
    auVar4 = auVar128 * auVar263 + auVar334 + auVar129 * auVar264 + auVar130 * auVar265 +
             auVar131 * ZEXT816(0x1000003d10);
    uVar356 = auVar4._0_8_;
    auVar335._8_8_ = 0;
    auVar335._0_8_ = uVar356 >> 0x34 | auVar4._8_8_ << 0xc;
    psStack_748 = (secp256k1_gej *)((uVar356 & 0xfffffffffffff) >> 0x30);
    psVar380 = (secp256k1_gej *)(uVar356 & 0xffffffffffff);
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_608._48_8_;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = auStack_608._48_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = psStack_5d0;
    auVar267._8_8_ = 0;
    auVar267._0_8_ = psVar382;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = (long)psStack_5c8 * 2;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = psStack_5c0;
    auVar4 = auVar133 * auVar267 + auVar335 + auVar134 * auVar268;
    uVar356 = auVar4._0_8_;
    auVar337._8_8_ = 0;
    auVar337._0_8_ = uVar356 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar269._8_8_ = 0;
    auVar269._0_8_ = (uVar356 & 0xfffffffffffff) << 4 | (ulong)psStack_748;
    auVar4 = auVar132 * auVar266 + ZEXT816(0x1000003d1) * auVar269;
    uVar356 = auVar4._0_8_;
    auStack_5a8._0_8_ = uVar356 & 0xfffffffffffff;
    auVar336._8_8_ = 0;
    auVar336._0_8_ = uVar356 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auStack_608._48_8_ * 2;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = psStack_5d0;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = psStack_5c8;
    auVar271._8_8_ = 0;
    auVar271._0_8_ = psVar382;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = psStack_5c0;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = psStack_5c0;
    auVar5 = auVar136 * auVar271 + auVar337 + auVar137 * auVar272;
    uVar356 = auVar5._0_8_;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar135 * auVar270 + auVar336 + auVar138 * ZEXT816(0x1000003d10);
    uVar361 = auVar4._0_8_;
    auVar339._8_8_ = 0;
    auVar339._0_8_ = uVar356 >> 0x34 | auVar5._8_8_ << 0xc;
    auStack_5a8._8_8_ = uVar361 & 0xfffffffffffff;
    auVar338._8_8_ = 0;
    auVar338._0_8_ = uVar361 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = auStack_608._48_8_ * 2;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = psStack_5c8;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = psStack_5d0;
    auVar274._8_8_ = 0;
    auVar274._0_8_ = psStack_5d0;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = psStack_5c0;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = psVar382;
    auVar339 = auVar141 * auVar275 + auVar339;
    uVar356 = auVar339._0_8_;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar139 * auVar273 + auVar338 + auVar140 * auVar274 + auVar142 * ZEXT816(0x1000003d10)
    ;
    uVar361 = auVar4._0_8_;
    psVar365 = (secp256k1_gej *)(uVar356 >> 0x34 | auVar339._8_8_ << 0xc);
    auStack_5a8._16_8_ = uVar361 & 0xfffffffffffff;
    auVar340._8_8_ = 0;
    auVar340._0_8_ = (uVar361 >> 0x34 | auVar4._8_8_ << 0xc) + auStack_738._0_8_;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = psVar365;
    auVar340 = auVar143 * ZEXT816(0x1000003d10) + auVar340;
    uVar356 = auVar340._0_8_;
    auStack_5a8._24_8_ = uVar356 & 0xfffffffffffff;
    auStack_5a8._32_8_ = (long)(psVar380->x).n + (uVar356 >> 0x34 | auVar340._8_8_ << 0xc);
    auStack_5a8._40_4_ = 1;
    auStack_5a8._44_4_ = 0;
    psStack_7c0 = (secp256k1_gej *)0x124938;
    psStack_740 = psVar380;
    secp256k1_fe_verify((secp256k1_fe *)psVar351);
    psStack_7c0 = (secp256k1_gej *)0x124940;
    secp256k1_fe_verify((secp256k1_fe *)psVar351);
    if (1 < (int)auStack_5a8._40_4_) goto LAB_00124f6c;
    auStack_5a8._0_8_ = 0x3ffffbfffff0bc - auStack_5a8._0_8_;
    auStack_5a8._8_8_ = 0x3ffffffffffffc - auStack_5a8._8_8_;
    auStack_5a8._16_8_ = 0x3ffffffffffffc - auStack_5a8._16_8_;
    auStack_5a8._24_8_ = 0x3ffffffffffffc - auStack_5a8._24_8_;
    auStack_5a8._32_8_ = 0x3fffffffffffc - auStack_5a8._32_8_;
    auStack_5a8._40_4_ = 2;
    auStack_5a8._44_4_ = 0;
    psStack_7c0 = (secp256k1_gej *)0x124996;
    secp256k1_fe_verify((secp256k1_fe *)auStack_5a8);
    psStack_7c0 = (secp256k1_gej *)0x1249ae;
    secp256k1_fe_mul((secp256k1_fe *)auStack_738,(secp256k1_fe *)auStack_5a8,
                     (secp256k1_fe *)(auStack_608 + 0x30));
    psVar380 = (secp256k1_gej *)(auStack_6d8 + 0x30);
    psStack_7c0 = (secp256k1_gej *)0x1249c6;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_678 + 0x30),(secp256k1_fe *)psVar380,
                     (secp256k1_fe *)auStack_5a8);
    psVar365 = (secp256k1_gej *)auStack_608;
    psStack_7c0 = (secp256k1_gej *)0x1249d6;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    psVar370 = (secp256k1_gej *)auStack_608._24_8_;
    psVar377 = (secp256k1_gej *)auStack_608._16_8_;
    psVar349 = psStack_7b0;
    psVar351 = psStack_7b0;
    if (6 < (int)uStack_770) goto LAB_00124f71;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = auStack_608._0_8_ * 2;
    auVar276._8_8_ = 0;
    auVar276._0_8_ = auStack_608._24_8_;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = auStack_608._8_8_ * 2;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = auStack_608._16_8_;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = auStack_608._32_8_;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = auStack_608._32_8_;
    uVar356 = SUB168(auVar146 * auVar278,0);
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar145 * auVar277 + auVar144 * auVar276 + auVar147 * ZEXT816(0x1000003d10);
    uVar361 = auVar4._0_8_;
    psStack_740 = (secp256k1_gej *)(uVar361 & 0xfffffffffffff);
    auVar341._8_8_ = 0;
    auVar341._0_8_ = uVar361 >> 0x34 | auVar4._8_8_ << 0xc;
    psVar382 = (secp256k1_gej *)(auStack_608._32_8_ * 2);
    auVar148._8_8_ = 0;
    auVar148._0_8_ = auStack_608._0_8_;
    auVar279._8_8_ = 0;
    auVar279._0_8_ = psVar382;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = auStack_608._8_8_ * 2;
    auVar280._8_8_ = 0;
    auVar280._0_8_ = auStack_608._24_8_;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = auStack_608._16_8_;
    auVar281._8_8_ = 0;
    auVar281._0_8_ = auStack_608._16_8_;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar356 >> 0x34 | SUB168(auVar146 * auVar278,8) << 0xc;
    auVar4 = auVar148 * auVar279 + auVar341 + auVar149 * auVar280 + auVar150 * auVar281 +
             auVar151 * ZEXT816(0x1000003d10);
    uVar356 = auVar4._0_8_;
    auVar342._8_8_ = 0;
    auVar342._0_8_ = uVar356 >> 0x34 | auVar4._8_8_ << 0xc;
    uStack_610 = (uVar356 & 0xfffffffffffff) >> 0x30;
    psVar380 = (secp256k1_gej *)(uVar356 & 0xffffffffffff);
    auVar152._8_8_ = 0;
    auVar152._0_8_ = auStack_608._0_8_;
    auVar282._8_8_ = 0;
    auVar282._0_8_ = auStack_608._0_8_;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = auStack_608._8_8_;
    auVar283._8_8_ = 0;
    auVar283._0_8_ = psVar382;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = auStack_608._16_8_ * 2;
    auVar284._8_8_ = 0;
    auVar284._0_8_ = auStack_608._24_8_;
    auVar4 = auVar153 * auVar283 + auVar342 + auVar154 * auVar284;
    uVar356 = auVar4._0_8_;
    auVar344._8_8_ = 0;
    auVar344._0_8_ = uVar356 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar285._8_8_ = 0;
    auVar285._0_8_ = (uVar356 & 0xfffffffffffff) << 4 | uStack_610;
    auVar4 = auVar152 * auVar282 + ZEXT816(0x1000003d1) * auVar285;
    uVar356 = auVar4._0_8_;
    (psStack_7b0->x).n[0] = uVar356 & 0xfffffffffffff;
    auVar343._8_8_ = 0;
    auVar343._0_8_ = uVar356 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = auStack_608._0_8_ * 2;
    auVar286._8_8_ = 0;
    auVar286._0_8_ = auStack_608._8_8_;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = auStack_608._16_8_;
    auVar287._8_8_ = 0;
    auVar287._0_8_ = psVar382;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = auStack_608._24_8_;
    auVar288._8_8_ = 0;
    auVar288._0_8_ = auStack_608._24_8_;
    auVar5 = auVar156 * auVar287 + auVar344 + auVar157 * auVar288;
    uVar356 = auVar5._0_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar155 * auVar286 + auVar343 + auVar158 * ZEXT816(0x1000003d10);
    uVar361 = auVar4._0_8_;
    auVar346._8_8_ = 0;
    auVar346._0_8_ = uVar356 >> 0x34 | auVar5._8_8_ << 0xc;
    (psStack_7b0->x).n[1] = uVar361 & 0xfffffffffffff;
    auVar345._8_8_ = 0;
    auVar345._0_8_ = uVar361 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = auStack_608._0_8_ * 2;
    auVar289._8_8_ = 0;
    auVar289._0_8_ = auStack_608._16_8_;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = auStack_608._8_8_;
    auVar290._8_8_ = 0;
    auVar290._0_8_ = auStack_608._8_8_;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = auStack_608._24_8_;
    auVar291._8_8_ = 0;
    auVar291._0_8_ = psVar382;
    auVar346 = auVar161 * auVar291 + auVar346;
    uVar356 = auVar346._0_8_;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar356 & 0xfffffffffffff;
    auVar4 = auVar159 * auVar289 + auVar345 + auVar160 * auVar290 + auVar162 * ZEXT816(0x1000003d10)
    ;
    uVar361 = auVar4._0_8_;
    (psStack_7b0->x).n[2] = uVar361 & 0xfffffffffffff;
    auVar347._8_8_ = 0;
    auVar347._0_8_ = (long)(psStack_740->x).n + (uVar361 >> 0x34 | auVar4._8_8_ << 0xc);
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar356 >> 0x34 | auVar346._8_8_ << 0xc;
    auVar347 = auVar163 * ZEXT816(0x1000003d10) + auVar347;
    uVar356 = auVar347._0_8_;
    (psStack_7b0->x).n[3] = uVar356 & 0xfffffffffffff;
    (psStack_7b0->x).n[4] = (long)(psVar380->x).n + (uVar356 >> 0x34 | auVar347._8_8_ << 0xc);
    (psStack_7b0->x).magnitude = 1;
    (psStack_7b0->x).normalized = 0;
    psStack_7c0 = (secp256k1_gej *)0x124c29;
    psStack_748 = psVar380;
    secp256k1_fe_verify(&psStack_7b0->x);
    psStack_7c0 = (secp256k1_gej *)0x124c31;
    secp256k1_fe_verify(&psVar349->x);
    psVar365 = (secp256k1_gej *)auStack_738;
    psStack_7c0 = (secp256k1_gej *)0x124c41;
    psVar351 = psVar365;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    iVar360 = auStack_738._40_4_ + (psVar349->x).magnitude;
    if (0x20 < iVar360) goto LAB_00124f76;
    uVar1 = (psVar349->x).n[1];
    uVar2 = (psVar349->x).n[2];
    uVar348 = (psVar349->x).n[3];
    (psVar349->x).n[0] = (psVar349->x).n[0] + auStack_738._0_8_;
    (psVar349->x).n[1] = uVar1 + auStack_738._8_8_;
    (psVar349->x).n[2] = uVar2 + auStack_738._16_8_;
    (psVar349->x).n[3] = uVar348 + auStack_738._24_8_;
    puVar375 = (psVar349->x).n + 4;
    *puVar375 = *puVar375 + auStack_738._32_8_;
    (psVar349->x).magnitude = iVar360;
    (psVar349->x).normalized = 0;
    psStack_7c0 = (secp256k1_gej *)0x124c99;
    secp256k1_fe_verify(&psVar349->x);
    psStack_7c0 = (secp256k1_gej *)0x124ca1;
    secp256k1_fe_verify(&psVar349->x);
    psVar365 = (secp256k1_gej *)(auStack_678 + 0x30);
    psStack_7c0 = (secp256k1_gej *)0x124cb1;
    psVar351 = psVar365;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    iVar360 = iStack_620 + (psVar349->x).magnitude;
    if (0x20 < iVar360) goto LAB_00124f7b;
    uVar1 = (psVar349->x).n[1];
    uVar2 = (psVar349->x).n[2];
    uVar348 = (psVar349->x).n[3];
    psVar365 = (secp256k1_gej *)(auStack_678 + 0x30);
    (psVar349->x).n[0] = (psVar349->x).n[0] + auStack_678._48_8_;
    (psVar349->x).n[1] = uVar1 + uStack_640;
    (psVar349->x).n[2] = uVar2 + uStack_638;
    (psVar349->x).n[3] = uVar348 + uStack_630;
    puVar375 = (psVar349->x).n + 4;
    *puVar375 = *puVar375 + uStack_628;
    (psVar349->x).magnitude = iVar360;
    (psVar349->x).normalized = 0;
    psStack_7c0 = (secp256k1_gej *)0x124d04;
    secp256k1_fe_verify(&psVar349->x);
    psStack_7c0 = (secp256k1_gej *)0x124d0c;
    secp256k1_fe_verify(&psVar349->x);
    psStack_7c0 = (secp256k1_gej *)0x124d14;
    psVar351 = psVar365;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    iVar360 = iStack_620 + (psVar349->x).magnitude;
    if (0x20 < iVar360) goto LAB_00124f80;
    uVar1 = (psVar349->x).n[1];
    uVar2 = (psVar349->x).n[2];
    uVar348 = (psVar349->x).n[3];
    psVar365 = (secp256k1_gej *)(auStack_678 + 0x30);
    (psVar349->x).n[0] = (psVar349->x).n[0] + auStack_678._48_8_;
    (psVar349->x).n[1] = uVar1 + uStack_640;
    (psVar349->x).n[2] = uVar2 + uStack_638;
    (psVar349->x).n[3] = uVar348 + uStack_630;
    puVar375 = (psVar349->x).n + 4;
    *puVar375 = *puVar375 + uStack_628;
    (psVar349->x).magnitude = iVar360;
    (psVar349->x).normalized = 0;
    psStack_7c0 = (secp256k1_gej *)0x124d67;
    secp256k1_fe_verify(&psVar349->x);
    psStack_7c0 = (secp256k1_gej *)0x124d6f;
    secp256k1_fe_verify((secp256k1_fe *)psVar365);
    psStack_7c0 = (secp256k1_gej *)0x124d77;
    psVar351 = psVar349;
    secp256k1_fe_verify(&psVar349->x);
    iVar360 = (psVar349->x).magnitude + iStack_620;
    if (iVar360 < 0x21) {
      auStack_678._48_8_ = (psVar349->x).n[0] + auStack_678._48_8_;
      uStack_640 = (psVar349->x).n[1] + uStack_640;
      uStack_638 = (psVar349->x).n[2] + uStack_638;
      uStack_630 = (psVar349->x).n[3] + uStack_630;
      uStack_628 = uStack_628 + (psVar349->x).n[4];
      iStack_61c = 0;
      psStack_7c0 = (secp256k1_gej *)0x124dcc;
      iStack_620 = iVar360;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_678 + 0x30));
      psVar365 = (secp256k1_gej *)&psVar349->y;
      psStack_7c0 = (secp256k1_gej *)0x124de3;
      secp256k1_fe_mul((secp256k1_fe *)psVar365,(secp256k1_fe *)(auStack_678 + 0x30),
                       (secp256k1_fe *)auStack_608);
      psVar382 = (secp256k1_gej *)auStack_738;
      psStack_7c0 = (secp256k1_gej *)0x124dfe;
      psVar380 = psVar382;
      secp256k1_fe_mul((secp256k1_fe *)psVar382,(secp256k1_fe *)psVar382,
                       (secp256k1_fe *)(auStack_738 + 0x30));
      psStack_7c0 = (secp256k1_gej *)0x124e06;
      secp256k1_fe_verify((secp256k1_fe *)psVar365);
      psStack_7c0 = (secp256k1_gej *)0x124e0e;
      psVar351 = psVar382;
      secp256k1_fe_verify((secp256k1_fe *)psVar382);
      iVar360 = auStack_738._40_4_ + (psVar349->y).magnitude;
      if (iVar360 < 0x21) {
        uVar1 = (psVar349->y).n[1];
        uVar2 = (psVar349->y).n[2];
        uVar348 = (psVar349->y).n[3];
        (psVar349->y).n[0] = (psVar349->y).n[0] + auStack_738._0_8_;
        (psVar349->y).n[1] = uVar1 + auStack_738._8_8_;
        (psVar349->y).n[2] = uVar2 + auStack_738._16_8_;
        (psVar349->y).n[3] = uVar348 + auStack_738._24_8_;
        puVar375 = (psVar349->y).n + 4;
        *puVar375 = *puVar375 + auStack_738._32_8_;
        (psVar349->y).magnitude = iVar360;
        (psVar349->y).normalized = 0;
        psStack_7c0 = (secp256k1_gej *)0x124e69;
        secp256k1_fe_verify((secp256k1_fe *)psVar365);
        psStack_7c0 = (secp256k1_gej *)0x124e71;
        secp256k1_gej_verify(psVar349);
        return;
      }
      goto LAB_00124f8a;
    }
  }
  else {
    psStack_7c0 = (secp256k1_gej *)0x124f4e;
    secp256k1_gej_add_var_cold_14();
LAB_00124f4e:
    psStack_7c0 = (secp256k1_gej *)0x124f53;
    secp256k1_gej_add_var_cold_13();
LAB_00124f53:
    psStack_7c0 = (secp256k1_gej *)0x124f58;
    secp256k1_gej_add_var_cold_12();
LAB_00124f58:
    psStack_7c0 = (secp256k1_gej *)0x124f5d;
    secp256k1_gej_add_var_cold_11();
LAB_00124f5d:
    psStack_7c0 = (secp256k1_gej *)0x124f62;
    secp256k1_gej_add_var_cold_10();
LAB_00124f62:
    psStack_7c0 = (secp256k1_gej *)0x124f67;
    secp256k1_gej_add_var_cold_9();
LAB_00124f67:
    psVar369 = psVar377;
    psVar381 = psVar349;
    psStack_7c0 = (secp256k1_gej *)0x124f6c;
    secp256k1_gej_add_var_cold_8();
LAB_00124f6c:
    psStack_7c0 = (secp256k1_gej *)0x124f71;
    secp256k1_gej_add_var_cold_7();
LAB_00124f71:
    psVar349 = psVar372;
    psVar370 = psVar369;
    psVar377 = psVar381;
    psStack_7c0 = (secp256k1_gej *)0x124f76;
    secp256k1_gej_add_var_cold_6();
LAB_00124f76:
    psStack_7c0 = (secp256k1_gej *)0x124f7b;
    secp256k1_gej_add_var_cold_5();
LAB_00124f7b:
    psStack_7c0 = (secp256k1_gej *)0x124f80;
    secp256k1_gej_add_var_cold_4();
LAB_00124f80:
    psStack_7c0 = (secp256k1_gej *)0x124f85;
    secp256k1_gej_add_var_cold_3();
  }
  psStack_7c0 = (secp256k1_gej *)0x124f8a;
  secp256k1_gej_add_var_cold_2();
LAB_00124f8a:
  psStack_7c0 = (secp256k1_gej *)secp256k1_ecmult_compute_table;
  secp256k1_gej_add_var_cold_1();
  psStack_7e0 = psVar365;
  psStack_7d8 = psVar377;
  psStack_7d0 = psVar370;
  psStack_7c8 = psVar382;
  psStack_7c0 = psVar349;
  memcpy(&sStack_878,psVar380,0x98);
  secp256k1_ge_set_gej_var(&sStack_8e0,&sStack_878);
  secp256k1_ge_to_storage((secp256k1_ge_storage *)psVar351,&sStack_8e0);
  secp256k1_gej_double_var(&sStack_878,psVar380,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej_var(&sStack_948,&sStack_878);
  lVar358 = 0x40;
  do {
    secp256k1_gej_set_ge(&sStack_878,&sStack_8e0);
    secp256k1_gej_add_ge_var(&sStack_878,&sStack_878,&sStack_948,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var(&sStack_8e0,&sStack_878);
    secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)(psVar351->x).n + lVar358),&sStack_8e0);
    lVar358 = lVar358 + 0x40;
  } while (lVar358 != 0x100);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    secp256k1_fe_verify(x);
    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;
    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    secp256k1_fe_verify(r);
}